

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_detection.cpp
# Opt level: O3

bool __thiscall
duckdb::CSVSniffer::CanYouCastIt
          (CSVSniffer *this,ClientContext *context,string_t value,LogicalType *type,
          DialectOptions *dialect_options,bool is_null,char decimal_separator,
          char thousands_separator)

{
  PhysicalType PVar1;
  undefined1 auVar2 [12];
  byte bVar3;
  string_t val;
  string_t input;
  string_t input_00;
  char *pcVar4;
  bool bVar5;
  DateCastResult DVar6;
  uint uVar7;
  BaseScanner *pBVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  char *pcVar10;
  byte *pbVar11;
  InvalidInputException *this_00;
  InternalException *pIVar12;
  LogicalType *this_01;
  ulong uVar13;
  char *pcVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  PhysicalType type_00;
  PhysicalType type_01;
  short sVar16;
  int iVar17;
  ulong uVar18;
  BaseScanner *pBVar19;
  ulong uVar20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var21;
  BaseScanner *this_02;
  ulong uVar22;
  ushort uVar23;
  char cVar24;
  byte bVar25;
  short sVar26;
  int iVar27;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var28;
  char *pcVar29;
  long lVar30;
  ulong uVar31;
  byte bVar32;
  LogicalType *pLVar33;
  byte bVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  element_type *peVar38;
  ulong uVar39;
  long lVar40;
  char *pcVar41;
  ushort uVar42;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var43;
  char *pcVar44;
  bool bVar45;
  from_chars_result fVar46;
  uint8_t scale;
  bool special;
  date_t dummy_value_2;
  string strip_thousands;
  uint8_t local_129;
  Value local_128;
  ClientContext *local_e8;
  BaseScanner *local_e0;
  ulong local_d8;
  ulong local_d0;
  string local_c8;
  Value local_a8;
  BaseScanner *local_68;
  char *local_60;
  undefined1 local_58 [40];
  
  this_01 = value.value._8_8_;
  local_e0 = value.value._0_8_;
  if ((int)dialect_options != 0) {
    return true;
  }
  this_02 = local_e0;
  if ((uint)context < 0xd) {
    this_02 = (BaseScanner *)((long)&local_e8 + 4);
  }
  local_68 = (BaseScanner *)local_58;
  local_60 = (char *)0x0;
  local_58[0] = 0;
  pLVar33 = type;
  local_e8 = context;
  bVar5 = LogicalType::IsNumeric(this_01);
  pcVar10 = (char *)((ulong)context & 0xffffffff);
  if (bVar5 && decimal_separator != '\0') {
    BaseScanner::RemoveSeparator_abi_cxx11_
              ((string *)&local_128,this_02,(char *)((ulong)context & 0xffffffff),
               (ulong)(uint)(int)decimal_separator,(char)pLVar33);
    ::std::__cxx11::string::operator=((string *)&local_68,(string *)&local_128);
    this_02 = local_68;
    pcVar10 = local_60;
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_128.type_._0_8_ !=
        &local_128.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete((void *)local_128.type_._0_8_);
      this_02 = local_68;
      pcVar10 = local_60;
    }
  }
  switch(this_01->id_) {
  case BOOLEAN:
    switch(pcVar10) {
    case (char *)0x1:
      iVar17 = tolower((int)*(char *)&this_02->_vptr_BaseScanner);
      bVar5 = (char)iVar17 == 'f' || (char)iVar17 == 't';
      goto LAB_01667445;
    case (char *)0x2:
      iVar17 = tolower((int)*(char *)&this_02->_vptr_BaseScanner);
      uVar37 = tolower((int)*(char *)((long)&this_02->_vptr_BaseScanner + 1));
      bVar5 = false;
      if (((char)iVar17 != 'n') || ((uVar37 & 0xff) != 0x6f)) goto LAB_01667445;
      break;
    case (char *)0x3:
      iVar17 = tolower((int)*(char *)&this_02->_vptr_BaseScanner);
      uVar37 = tolower((int)*(char *)((long)&this_02->_vptr_BaseScanner + 1));
      uVar36 = tolower((int)*(char *)((long)&this_02->_vptr_BaseScanner + 2));
      if ((char)iVar17 != 'y') goto switchD_01662c6a_default;
      bVar5 = false;
      if (((uVar37 & 0xff) != 0x65) || ((uVar36 & 0xff) != 0x73)) goto LAB_01667445;
      break;
    case (char *)0x4:
      iVar17 = tolower((int)*(char *)&this_02->_vptr_BaseScanner);
      uVar37 = tolower((int)*(char *)((long)&this_02->_vptr_BaseScanner + 1));
      uVar36 = tolower((int)*(char *)((long)&this_02->_vptr_BaseScanner + 2));
      uVar7 = tolower((int)*(char *)((long)&this_02->_vptr_BaseScanner + 3));
      if (((char)iVar17 != 't') || ((uVar37 & 0xff) != 0x72)) goto switchD_01662c6a_default;
      bVar5 = false;
      if ((uVar36 & 0xff) != 0x75) goto LAB_01667445;
LAB_01663751:
      bVar5 = false;
      if ((uVar7 & 0xff) != 0x65) goto LAB_01667445;
      break;
    case (char *)0x5:
      iVar17 = tolower((int)*(char *)&this_02->_vptr_BaseScanner);
      uVar37 = tolower((int)*(char *)((long)&this_02->_vptr_BaseScanner + 1));
      uVar36 = tolower((int)*(char *)((long)&this_02->_vptr_BaseScanner + 2));
      uVar35 = tolower((int)*(char *)((long)&this_02->_vptr_BaseScanner + 3));
      uVar7 = tolower((int)*(char *)((long)&this_02->_vptr_BaseScanner + 4));
      if ((((char)iVar17 == 'f') && ((uVar37 & 0xff) == 0x61)) && ((uVar36 & 0xff) == 0x6c)) {
        bVar5 = false;
        if ((uVar35 & 0xff) != 0x73) goto LAB_01667445;
        goto LAB_01663751;
      }
    default:
      goto switchD_01662c6a_default;
    }
    goto switchD_01662c4d_caseD_19;
  case TINYINT:
    if (pcVar10 == (char *)0x0) goto switchD_01662c6a_default;
    bVar5 = true;
    pcVar14 = (char *)0x0;
    do {
      bVar25 = pcVar14[(long)(&this_02->states + -0x20)];
      uVar37 = (uint)bVar25;
      if ((4 < uVar37 - 9) && (uVar37 != 0x20)) {
        if (uVar37 == 0x2d) {
          if (pcVar10 + -1 != pcVar14) {
            uVar13 = (long)pcVar10 - (long)pcVar14;
            cVar24 = '\0';
            uVar18 = 1;
            goto LAB_01662e49;
          }
          break;
        }
        if ((pcVar10 + -1 != pcVar14) && (bVar25 == 0x30)) {
          bVar34 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar14];
          if (bVar34 < 0x62) {
            if (bVar34 == 0x42) {
LAB_0166499d:
              pcVar44 = pcVar10 + ~(ulong)pcVar14;
              if (&DAT_00000001 < pcVar44) {
                pcVar41 = &DAT_00000001;
                bVar25 = 0;
                goto LAB_016649b7;
              }
              break;
            }
            if (bVar34 == 0x58) {
LAB_01664318:
              pcVar44 = pcVar10 + ~(ulong)pcVar14;
              if (&DAT_00000001 < pcVar44) {
                pcVar41 = &DAT_00000001;
                cVar24 = '\0';
                goto LAB_0166433c;
              }
              break;
            }
          }
          else {
            if (bVar34 == 0x62) goto LAB_0166499d;
            if (bVar34 == 0x78) goto LAB_01664318;
          }
        }
        uVar20 = (long)pcVar10 - (long)pcVar14;
        uVar13 = (ulong)(bVar25 == 0x2b);
        uVar18 = 1;
        if (uVar20 <= uVar13) goto LAB_01664ed0;
        cVar24 = '\0';
        uVar22 = uVar13;
        goto LAB_016638f7;
      }
      pcVar14 = pcVar14 + 1;
    } while (pcVar10 != pcVar14);
    goto LAB_01664edc;
  case SMALLINT:
    if (pcVar10 != (char *)0x0) {
      pcVar14 = (char *)0x0;
      do {
        bVar25 = pcVar14[(long)(&this_02->states + -0x20)];
        if ((4 < bVar25 - 9) && (bVar25 != 0x20)) {
          local_a8.type_.id_ = INVALID;
          local_a8.type_.physical_type_ = ~INVALID;
          if (bVar25 == 0x2d) {
            bVar45 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                               (pcVar14 + (long)(&this_02->states + -0x20),
                                (long)pcVar10 - (long)pcVar14,(IntegerCastData<short> *)&local_a8,
                                true);
          }
          else {
            if ((pcVar10 + -1 != pcVar14) && (bVar25 == 0x30)) {
              bVar25 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar14];
              if (bVar25 < 0x62) {
                if (bVar25 == 0x42) {
LAB_01663e58:
                  pcVar44 = pcVar10 + ~(ulong)pcVar14;
                  if (&DAT_00000001 < pcVar44) {
                    pcVar41 = &DAT_00000001;
                    sVar16 = 0;
                    goto LAB_01663e72;
                  }
                  break;
                }
                if (bVar25 == 0x58) {
LAB_01663ac0:
                  pcVar44 = pcVar10 + ~(ulong)pcVar14;
                  if (&DAT_00000001 < pcVar44) {
                    pcVar41 = &DAT_00000001;
                    sVar16 = 0;
                    goto LAB_01663ae4;
                  }
                  break;
                }
              }
              else {
                if (bVar25 == 0x62) goto LAB_01663e58;
                if (bVar25 == 0x78) goto LAB_01663ac0;
              }
              if ((byte)(bVar25 - 0x30) < 10) break;
            }
            bVar45 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                               (pcVar14 + (long)(&this_02->states + -0x20),
                                (long)pcVar10 - (long)pcVar14,(IntegerCastData<short> *)&local_a8,
                                true);
          }
          bVar5 = true;
          if (bVar45 != false) goto LAB_01667445;
          break;
        }
        pcVar14 = pcVar14 + 1;
      } while (pcVar10 != pcVar14);
LAB_0166541a:
      do {
        bVar25 = *(byte *)&this_02->_vptr_BaseScanner;
        if ((4 < bVar25 - 9) && (bVar25 != 0x20)) {
          local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
          local_128.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_128.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (bVar25 == 0x2d) {
            if (pcVar10 != &DAT_00000001) {
              pcVar14 = &DAT_00000001;
              lVar40 = -2;
              pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              goto LAB_01665535;
            }
            IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,true>
                      ((IntegerDecimalCastData<short> *)&local_128);
            break;
          }
          if ((pcVar10 == &DAT_00000001) || (bVar25 != 0x30)) {
            if (bVar25 == 0x2b) break;
          }
          else {
            bVar25 = *(byte *)((long)&this_02->_vptr_BaseScanner + 1);
            if (0x61 < bVar25) {
              if (bVar25 == 0x62) {
LAB_016656f4:
                pcVar10 = pcVar10 + -1;
                if (&DAT_00000001 < pcVar10) {
                  pcVar14 = &DAT_00000001;
                  pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
                  goto LAB_01665712;
                }
              }
              else {
                if (bVar25 != 0x78) goto LAB_01665492;
LAB_016655db:
                pcVar10 = pcVar10 + -1;
                if (&DAT_00000001 < pcVar10) {
                  pcVar14 = &DAT_00000001;
                  pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
                  goto LAB_01665603;
                }
              }
              IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                        ((IntegerDecimalCastData<short> *)&local_128);
              break;
            }
            if (bVar25 == 0x42) goto LAB_016656f4;
            if (bVar25 == 0x58) goto LAB_016655db;
LAB_01665492:
            if ((byte)(bVar25 - 0x30) < 10) break;
          }
          lVar40 = -1;
          pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
          pcVar14 = (char *)0x0;
          goto LAB_016654c5;
        }
        this_02 = (BaseScanner *)((long)&this_02->_vptr_BaseScanner + 1);
        pcVar10 = pcVar10 + -1;
      } while (pcVar10 != (char *)0x0);
    }
    goto switchD_01662c6a_default;
  case INTEGER:
    if (pcVar10 == (char *)0x0) goto switchD_01662c6a_default;
    bVar5 = true;
    pcVar14 = pcVar10;
    pBVar8 = this_02;
    pBVar19 = this_02;
    do {
      pBVar19 = (BaseScanner *)((long)&pBVar19->_vptr_BaseScanner + 1);
      bVar25 = *(byte *)&pBVar8->_vptr_BaseScanner;
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) {
        if (bVar25 == 0x2d) {
          if (pcVar14 != &DAT_00000001) {
            pcVar44 = &DAT_00000001;
            iVar17 = 0;
            lVar40 = -2;
            goto LAB_016632c2;
          }
          break;
        }
        if ((pcVar14 == &DAT_00000001) || (bVar25 != 0x30)) {
          if (bVar25 == 0x2b) break;
        }
        else {
          bVar25 = *(byte *)((long)&pBVar8->_vptr_BaseScanner + 1);
          if (bVar25 < 0x62) {
            if (bVar25 == 0x42) {
LAB_01664bd4:
              pcVar14 = pcVar14 + -1;
              if (&DAT_00000001 < pcVar14) {
                iVar17 = 0;
                pcVar44 = &DAT_00000001;
                goto LAB_01664be8;
              }
              break;
            }
            if (bVar25 == 0x58) {
LAB_01664792:
              pcVar14 = pcVar14 + -1;
              if (&DAT_00000001 < pcVar14) {
                iVar17 = 0;
                pcVar44 = &DAT_00000001;
                goto LAB_016647b0;
              }
              break;
            }
          }
          else {
            if (bVar25 == 0x62) goto LAB_01664bd4;
            if (bVar25 == 0x78) goto LAB_01664792;
          }
          if ((byte)(bVar25 - 0x30) < 10) break;
        }
        iVar17 = 0;
        lVar40 = -1;
        goto LAB_01663e06;
      }
      pBVar8 = (BaseScanner *)((long)&pBVar8->_vptr_BaseScanner + 1);
      pcVar14 = pcVar14 + -1;
    } while (pcVar14 != (char *)0x0);
    goto LAB_01666c4f;
  case BIGINT:
    if (pcVar10 == (char *)0x0) goto switchD_01662c6a_default;
    bVar5 = true;
    pcVar14 = pcVar10;
    pBVar8 = this_02;
    pBVar19 = this_02;
    do {
      pBVar19 = (BaseScanner *)((long)&pBVar19->_vptr_BaseScanner + 1);
      bVar25 = *(byte *)&pBVar8->_vptr_BaseScanner;
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) {
        if (bVar25 == 0x2d) {
          if (pcVar14 != &DAT_00000001) {
            pcVar44 = &DAT_00000001;
            lVar40 = -2;
            lVar30 = 0;
            goto LAB_01662f5a;
          }
          break;
        }
        if ((pcVar14 == &DAT_00000001) || (bVar25 != 0x30)) {
          if (bVar25 == 0x2b) break;
        }
        else {
          bVar25 = *(byte *)((long)&pBVar8->_vptr_BaseScanner + 1);
          if (bVar25 < 0x62) {
            if (bVar25 == 0x42) {
LAB_01664a37:
              pcVar14 = pcVar14 + -1;
              if (&DAT_00000001 < pcVar14) {
                pcVar44 = &DAT_00000001;
                lVar40 = 0;
                goto LAB_01664a55;
              }
              break;
            }
            if (bVar25 == 0x58) {
LAB_0166444d:
              pcVar14 = pcVar14 + -1;
              if (&DAT_00000001 < pcVar14) {
                pcVar44 = &DAT_00000001;
                lVar40 = 0;
                goto LAB_01664476;
              }
              break;
            }
          }
          else {
            if (bVar25 == 0x62) goto LAB_01664a37;
            if (bVar25 == 0x78) goto LAB_0166444d;
          }
          if ((byte)(bVar25 - 0x30) < 10) break;
        }
        lVar30 = -1;
        lVar40 = 0;
        goto LAB_01663cdd;
      }
      pBVar8 = (BaseScanner *)((long)&pBVar8->_vptr_BaseScanner + 1);
      pcVar14 = pcVar14 + -1;
    } while (pcVar14 != (char *)0x0);
    goto LAB_01666054;
  case DATE:
    p_Var15 = type[3].type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    p_Var43 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&type[3].type_info_;
    p_Var9 = p_Var43;
    p_Var28 = p_Var43;
    if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      do {
        bVar5 = *(byte *)&p_Var15[2]._vptr__Sp_counted_base < 0xf;
        if (!bVar5) {
          p_Var9 = p_Var15;
        }
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (&p_Var15[1]._vptr__Sp_counted_base)[bVar5];
      } while (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
      if ((p_Var9 != p_Var43) &&
         (p_Var28 = p_Var9, 0xf < *(byte *)&p_Var9[2]._vptr__Sp_counted_base)) {
        p_Var28 = p_Var43;
      }
    }
    bVar5 = StrTimeFormat::Empty((StrTimeFormat *)(p_Var28 + 3));
    if (bVar5) {
      DVar6 = Date::TryConvertDate
                        ((char *)this_02,(idx_t)pcVar10,(idx_t *)&local_128,(date_t *)&local_a8,
                         (bool *)&local_c8,true);
LAB_016633e3:
      bVar5 = DVar6 == SUCCESS;
      break;
    }
    local_128.type_._0_8_ =
         &local_128.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_128.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_128.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_128.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
         0xffffffffffffff00;
    p_Var15 = type[3].type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    p_Var9 = p_Var43;
    if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      do {
        bVar5 = *(byte *)&p_Var15[2]._vptr__Sp_counted_base < 0xf;
        if (!bVar5) {
          p_Var9 = p_Var15;
        }
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (&p_Var15[1]._vptr__Sp_counted_base)[bVar5];
      } while (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
      if ((p_Var9 != p_Var43) && (*(byte *)&p_Var9[2]._vptr__Sp_counted_base < 0x10)) {
        p_Var43 = p_Var9;
      }
    }
    input.value.pointer.ptr = (char *)local_e0;
    input.value._0_8_ = local_e8;
    bVar5 = StrpTimeFormat::TryParseDate
                      ((StrpTimeFormat *)(p_Var43 + 3),input,(date_t *)&local_a8,
                       (string *)&local_128);
    goto LAB_0166357d;
  case TIME:
    bVar5 = Time::TryConvertTime
                      ((char *)this_02,(idx_t)pcVar10,(idx_t *)&local_128,(dtime_t *)&local_a8,true,
                       (optional_ptr<int,_true>)0x0);
    break;
  default:
    LogicalType::LogicalType((LogicalType *)(local_58 + 0x10),SQLNULL);
    Value::Value(&local_128,(LogicalType *)(local_58 + 0x10));
    LogicalType::~LogicalType((LogicalType *)(local_58 + 0x10));
    local_c8._M_string_length = 0;
    local_c8.field_2._M_local_buf[0] = '\0';
    val.value.pointer.ptr = (char *)local_e0;
    val.value._0_8_ = local_e8;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    Value::Value(&local_a8,val);
    bVar5 = Value::TryCastAs(&local_a8,(ClientContext *)this,this_01,&local_128,&local_c8,true);
    bVar45 = local_c8._M_string_length == 0;
    Value::~Value(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    bVar5 = bVar5 && bVar45;
    Value::~Value(&local_128);
    break;
  case TIMESTAMP:
    p_Var15 = type[3].type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    p_Var43 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&type[3].type_info_;
    p_Var9 = p_Var43;
    p_Var28 = p_Var43;
    if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      do {
        bVar5 = *(byte *)&p_Var15[2]._vptr__Sp_counted_base < 0x13;
        if (!bVar5) {
          p_Var9 = p_Var15;
        }
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (&p_Var15[1]._vptr__Sp_counted_base)[bVar5];
      } while (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
      if ((p_Var9 != p_Var43) &&
         (p_Var28 = p_Var9, 0x13 < *(byte *)&p_Var9[2]._vptr__Sp_counted_base)) {
        p_Var28 = p_Var43;
      }
    }
    bVar5 = StrTimeFormat::Empty((StrTimeFormat *)(p_Var28 + 3));
    if (bVar5) {
      DVar6 = Timestamp::TryConvertTimestamp
                        ((char *)this_02,(idx_t)pcVar10,(timestamp_t *)&local_a8,
                         (optional_ptr<int,_true>)0x0,true);
      goto LAB_016633e3;
    }
    local_128.type_._0_8_ =
         &local_128.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_128.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_128.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_128.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
         0xffffffffffffff00;
    p_Var15 = type[3].type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    p_Var9 = p_Var43;
    if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      do {
        bVar5 = *(byte *)&p_Var15[2]._vptr__Sp_counted_base < 0x13;
        if (!bVar5) {
          p_Var9 = p_Var15;
        }
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (&p_Var15[1]._vptr__Sp_counted_base)[bVar5];
      } while (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
      if ((p_Var9 != p_Var43) && (*(byte *)&p_Var9[2]._vptr__Sp_counted_base < 0x14)) {
        p_Var43 = p_Var9;
      }
    }
    input_00.value.pointer.ptr = (char *)local_e0;
    input_00.value._0_8_ = local_e8;
    bVar5 = StrpTimeFormat::TryParseTimestamp
                      ((StrpTimeFormat *)(p_Var43 + 3),input_00,(timestamp_t *)&local_a8,
                       (string *)&local_128);
LAB_0166357d:
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_128.type_._0_8_ !=
        &local_128.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete((void *)local_128.type_._0_8_);
    }
    break;
  case DECIMAL:
    LogicalType::GetDecimalProperties(this_01,(uint8_t *)&local_c8,&local_129);
    if (is_null == true) {
      PVar1 = this_01->physical_type_;
      if (PVar1 < INT64) {
        if (PVar1 == INT16) {
          bVar5 = TryDecimalStringCast<short,(char)46>
                            ((char *)this_02,(idx_t)pcVar10,(short *)&local_128,
                             (uint8_t)local_c8._M_dataplus._M_p,local_129);
        }
        else {
          if (PVar1 != INT32) {
LAB_01667523:
            pIVar12 = (InternalException *)__cxa_allocate_exception(0x10);
            TypeIdToString_abi_cxx11_
                      ((string *)&local_a8,(duckdb *)(ulong)this_01->physical_type_,type_00);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_128,"Invalid Physical Type for Decimal Value. Physical Type: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_a8);
            InternalException::InternalException(pIVar12,(string *)&local_128);
            __cxa_throw(pIVar12,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          bVar5 = TryDecimalStringCast<int,(char)46>
                            ((char *)this_02,(idx_t)pcVar10,(int *)&local_128,
                             (uint8_t)local_c8._M_dataplus._M_p,local_129);
        }
      }
      else if (PVar1 == INT64) {
        bVar5 = TryDecimalStringCast<long,(char)46>
                          ((char *)this_02,(idx_t)pcVar10,(long *)&local_128,
                           (uint8_t)local_c8._M_dataplus._M_p,local_129);
      }
      else {
        if (PVar1 != INT128) goto LAB_01667523;
        bVar5 = TryDecimalStringCast<duckdb::hugeint_t,(char)46>
                          ((char *)this_02,(idx_t)pcVar10,(hugeint_t *)&local_128,
                           (uint8_t)local_c8._M_dataplus._M_p,local_129);
      }
    }
    else {
      if (is_null != true) {
        this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_128.type_._0_8_ =
             &local_128.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,
                   "Decimals can only have \',\' and \'.\' as decimal separators","");
        InvalidInputException::InvalidInputException(this_00,(string *)&local_128);
        __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      PVar1 = this_01->physical_type_;
      if (PVar1 < INT64) {
        if (PVar1 == INT16) {
          bVar5 = TryDecimalStringCast<short,(char)44>
                            ((char *)this_02,(idx_t)pcVar10,(short *)&local_128,
                             (uint8_t)local_c8._M_dataplus._M_p,local_129);
        }
        else {
          if (PVar1 != INT32) {
LAB_01667586:
            pIVar12 = (InternalException *)__cxa_allocate_exception(0x10);
            TypeIdToString_abi_cxx11_
                      ((string *)&local_a8,(duckdb *)(ulong)this_01->physical_type_,type_01);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_128,"Invalid Physical Type for Decimal Value. Physical Type: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_a8);
            InternalException::InternalException(pIVar12,(string *)&local_128);
            __cxa_throw(pIVar12,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          bVar5 = TryDecimalStringCast<int,(char)44>
                            ((char *)this_02,(idx_t)pcVar10,(int *)&local_128,
                             (uint8_t)local_c8._M_dataplus._M_p,local_129);
        }
      }
      else if (PVar1 == INT64) {
        bVar5 = TryDecimalStringCast<long,(char)44>
                          ((char *)this_02,(idx_t)pcVar10,(long *)&local_128,
                           (uint8_t)local_c8._M_dataplus._M_p,local_129);
      }
      else {
        if (PVar1 != INT128) goto LAB_01667586;
        bVar5 = TryDecimalStringCast<duckdb::hugeint_t,(char)44>
                          ((char *)this_02,(idx_t)pcVar10,(hugeint_t *)&local_128,
                           (uint8_t)local_c8._M_dataplus._M_p,local_129);
      }
    }
    break;
  case FLOAT:
    for (; pcVar10 != (char *)0x0; pcVar10 = (char *)((long)pcVar10 + -1)) {
      bVar25 = *(byte *)this_02;
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) {
        if ((bVar25 != 0x2b) &&
           (((pcVar10 == &DAT_00000001 || (bVar25 != 0x30)) ||
            (9 < (byte)(*(char *)((long)this_02 + 1) - 0x30U))))) {
          pcVar10 = (char *)((long)pcVar10 + (long)this_02);
          fVar46 = duckdb_fast_float::from_chars<float>
                             ((char *)this_02,pcVar10,(float *)&local_128,true,is_null,general);
          auVar2 = fVar46._0_12_;
LAB_01663013:
          bVar5 = auVar2._0_8_ == pcVar10 && auVar2._8_4_ == 0;
          goto LAB_01667445;
        }
        break;
      }
      this_02 = (BaseScanner *)((long)this_02 + 1);
    }
    goto switchD_01662c6a_default;
  case DOUBLE:
    for (; pcVar10 != (char *)0x0; pcVar10 = pcVar10 + -1) {
      bVar25 = *(byte *)&this_02->_vptr_BaseScanner;
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) {
        if ((bVar25 != 0x2b) &&
           (((pcVar10 == &DAT_00000001 || (bVar25 != 0x30)) ||
            (9 < (byte)(*(char *)((long)&this_02->_vptr_BaseScanner + 1) - 0x30U))))) {
          pcVar10 = pcVar10 + (long)this_02;
          fVar46 = duckdb_fast_float::from_chars<double>
                             ((char *)this_02,pcVar10,(double *)&local_128,true,is_null,general);
          auVar2 = fVar46._0_12_;
          goto LAB_01663013;
        }
        break;
      }
      this_02 = (BaseScanner *)((long)&this_02->_vptr_BaseScanner + 1);
    }
    goto switchD_01662c6a_default;
  case VARCHAR:
    goto switchD_01662c4d_caseD_19;
  case UTINYINT:
    if (pcVar10 == (char *)0x0) goto switchD_01662c6a_default;
    bVar5 = true;
    pcVar14 = pcVar10;
    pBVar8 = this_02;
    pBVar19 = this_02;
    do {
      pBVar19 = (BaseScanner *)((long)&pBVar19->_vptr_BaseScanner + 1);
      bVar25 = *(byte *)&pBVar8->_vptr_BaseScanner;
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) {
        if (bVar25 == 0x2d) {
          if (pcVar14 != &DAT_00000001) {
            pcVar44 = &DAT_00000001;
            lVar40 = -2;
            goto LAB_01662dd1;
          }
          break;
        }
        if ((pcVar14 == &DAT_00000001) || (bVar25 != 0x30)) {
          if (bVar25 == 0x2b) break;
        }
        else {
          bVar25 = *(byte *)((long)&pBVar8->_vptr_BaseScanner + 1);
          if (bVar25 < 0x62) {
            if (bVar25 == 0x42) {
LAB_0166491b:
              pcVar14 = pcVar14 + -1;
              if (&DAT_00000001 < pcVar14) {
                pcVar44 = &DAT_00000001;
                bVar25 = 0;
                goto LAB_0166492f;
              }
              break;
            }
            if (bVar25 == 0x58) {
LAB_01664205:
              pcVar14 = pcVar14 + -1;
              if (&DAT_00000001 < pcVar14) {
                pcVar44 = &DAT_00000001;
                bVar25 = 0;
                goto LAB_01664223;
              }
              break;
            }
          }
          else {
            if (bVar25 == 0x62) goto LAB_0166491b;
            if (bVar25 == 0x78) goto LAB_01664205;
          }
          if ((byte)(bVar25 - 0x30) < 10) break;
        }
        lVar40 = -1;
        bVar25 = 0;
        goto LAB_01663c60;
      }
      pBVar8 = (BaseScanner *)((long)&pBVar8->_vptr_BaseScanner + 1);
      pcVar14 = pcVar14 + -1;
    } while (pcVar14 != (char *)0x0);
    goto LAB_01665c5c;
  case USMALLINT:
    if (pcVar10 == (char *)0x0) goto switchD_01662c6a_default;
    bVar5 = true;
    pcVar14 = pcVar10;
    pBVar8 = this_02;
    pBVar19 = this_02;
    do {
      pBVar19 = (BaseScanner *)((long)&pBVar19->_vptr_BaseScanner + 1);
      bVar25 = *(byte *)&pBVar8->_vptr_BaseScanner;
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) {
        if (bVar25 == 0x2d) {
          if (pcVar14 != &DAT_00000001) {
            pcVar44 = &DAT_00000001;
            lVar40 = -2;
            goto LAB_01662ce2;
          }
          break;
        }
        if ((pcVar14 == &DAT_00000001) || (bVar25 != 0x30)) {
          if (bVar25 == 0x2b) break;
        }
        else {
          bVar25 = *(byte *)((long)&pBVar8->_vptr_BaseScanner + 1);
          if (bVar25 < 0x62) {
            if (bVar25 == 0x42) {
LAB_01664896:
              pcVar14 = pcVar14 + -1;
              if (&DAT_00000001 < pcVar14) {
                pcVar44 = &DAT_00000001;
                sVar16 = 0;
                goto LAB_016648aa;
              }
              break;
            }
            if (bVar25 == 0x58) {
LAB_016640e8:
              pcVar14 = pcVar14 + -1;
              if (&DAT_00000001 < pcVar14) {
                pcVar44 = &DAT_00000001;
                uVar37 = 0;
                goto LAB_01664106;
              }
              break;
            }
          }
          else {
            if (bVar25 == 0x62) goto LAB_01664896;
            if (bVar25 == 0x78) goto LAB_016640e8;
          }
          if ((byte)(bVar25 - 0x30) < 10) break;
        }
        lVar40 = -1;
        uVar23 = 0;
        goto LAB_01663bf4;
      }
      pBVar8 = (BaseScanner *)((long)&pBVar8->_vptr_BaseScanner + 1);
      pcVar14 = pcVar14 + -1;
    } while (pcVar14 != (char *)0x0);
    goto LAB_01665863;
  case UINTEGER:
    if (pcVar10 == (char *)0x0) goto switchD_01662c6a_default;
    bVar5 = true;
    pcVar14 = pcVar10;
    pBVar8 = this_02;
    pBVar19 = this_02;
    do {
      pBVar19 = (BaseScanner *)((long)&pBVar19->_vptr_BaseScanner + 1);
      bVar25 = *(byte *)&pBVar8->_vptr_BaseScanner;
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) {
        if (bVar25 == 0x2d) {
          if (pcVar14 != &DAT_00000001) {
            pcVar44 = &DAT_00000001;
            lVar40 = -2;
            goto LAB_01663121;
          }
          break;
        }
        if ((pcVar14 == &DAT_00000001) || (bVar25 != 0x30)) {
          if (bVar25 == 0x2b) break;
        }
        else {
          bVar25 = *(byte *)((long)&pBVar8->_vptr_BaseScanner + 1);
          if (bVar25 < 0x62) {
            if (bVar25 == 0x42) {
LAB_01664aca:
              pcVar14 = pcVar14 + -1;
              if (&DAT_00000001 < pcVar14) {
                iVar17 = 0;
                pcVar44 = &DAT_00000001;
                goto LAB_01664ade;
              }
              break;
            }
            if (bVar25 == 0x58) {
LAB_0166456c:
              pcVar14 = pcVar14 + -1;
              if (&DAT_00000001 < pcVar14) {
                uVar37 = 0;
                pcVar44 = &DAT_00000001;
                goto LAB_0166458a;
              }
              break;
            }
          }
          else {
            if (bVar25 == 0x62) goto LAB_01664aca;
            if (bVar25 == 0x78) goto LAB_0166456c;
          }
          if ((byte)(bVar25 - 0x30) < 10) break;
        }
        uVar37 = 0;
        lVar40 = -1;
        goto LAB_01663d3f;
      }
      pBVar8 = (BaseScanner *)((long)&pBVar8->_vptr_BaseScanner + 1);
      pcVar14 = pcVar14 + -1;
    } while (pcVar14 != (char *)0x0);
    goto LAB_0166644d;
  case UBIGINT:
    if (pcVar10 == (char *)0x0) goto switchD_01662c6a_default;
    bVar5 = true;
    pBVar8 = this_02;
    pcVar14 = pcVar10;
    pBVar19 = this_02;
    do {
      pBVar19 = (BaseScanner *)((long)&pBVar19->_vptr_BaseScanner + 1);
      bVar25 = *(byte *)&pBVar8->_vptr_BaseScanner;
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) {
        if (bVar25 == 0x2d) {
          if (pcVar14 != &DAT_00000001) {
            pcVar44 = &DAT_00000001;
            lVar40 = -2;
            goto LAB_0166319f;
          }
          break;
        }
        if ((pcVar14 == &DAT_00000001) || (bVar25 != 0x30)) {
          if (bVar25 == 0x2b) break;
        }
        else {
          bVar25 = *(byte *)((long)&pBVar8->_vptr_BaseScanner + 1);
          if (bVar25 < 0x62) {
            if (bVar25 == 0x42) {
LAB_01664b50:
              pcVar14 = pcVar14 + -1;
              if (&DAT_00000001 < pcVar14) {
                pcVar44 = &DAT_00000001;
                lVar40 = 0;
                goto LAB_01664b64;
              }
              break;
            }
            if (bVar25 == 0x58) {
LAB_0166467e:
              pcVar14 = pcVar14 + -1;
              if (&DAT_00000001 < pcVar14) {
                pcVar44 = &DAT_00000001;
                uVar18 = 0;
                goto LAB_0166469c;
              }
              break;
            }
          }
          else {
            if (bVar25 == 0x62) goto LAB_01664b50;
            if (bVar25 == 0x78) goto LAB_0166467e;
          }
          if ((byte)(bVar25 - 0x30) < 10) break;
        }
        lVar40 = -1;
        uVar18 = 0;
        goto LAB_01663da9;
      }
      pBVar8 = (BaseScanner *)((long)&pBVar8->_vptr_BaseScanner + 1);
      pcVar14 = pcVar14 + -1;
    } while (pcVar14 != (char *)0x0);
    goto LAB_01666845;
  }
  goto LAB_01667445;
  while( true ) {
    pcVar44 = pcVar44 + 1;
    lVar40 = lVar40 + -1;
    pcVar41 = pcVar14;
    if (pcVar14 == pcVar44) break;
LAB_0166319f:
    bVar25 = pcVar44[(long)(&pBVar8->states + -0x20)];
    if (9 < (byte)(bVar25 - 0x30)) {
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto LAB_01666845;
      pcVar44 = (char *)-lVar40;
      pcVar41 = pcVar44;
      if (pcVar44 < pcVar14) {
        pbVar11 = (byte *)((long)pBVar8 - lVar40);
        goto LAB_01664005;
      }
      break;
    }
  }
  goto LAB_0166402a;
  while( true ) {
    pcVar44 = pcVar44 + 1;
    pbVar11 = pbVar11 + 1;
    pcVar41 = pcVar14;
    if (pcVar14 <= pcVar44) break;
LAB_01664005:
    if ((4 < *pbVar11 - 9) && (*pbVar11 != 0x20)) goto LAB_01666845;
  }
LAB_0166402a:
  if ((char *)0x1 < pcVar41) goto LAB_01667445;
LAB_01666845:
  pcVar14 = (char *)0x0;
  do {
    bVar25 = pcVar14[(long)(&this_02->states + -0x20)];
    if ((4 < bVar25 - 9) && (bVar25 != 0x20)) {
      local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pcVar44 = pcVar10 + -(long)pcVar14;
      if (bVar25 == 0x2d) {
        if (pcVar10 + -1 != pcVar14) {
          bVar25 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar14];
          pcVar10 = (char *)0x2;
          local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
          goto joined_r0x01666955;
        }
        IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,true>
                  ((IntegerDecimalCastData<unsigned_long> *)&local_128);
        break;
      }
      if ((pcVar10 + -1 == pcVar14) || (bVar25 != 0x30)) {
        if (bVar25 == 0x2b) break;
      }
      else {
        bVar25 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar14];
        if (0x61 < bVar25) {
          if (bVar25 == 0x62) {
LAB_01666afe:
            pcVar44 = pcVar10 + ~(ulong)pcVar14;
            if (&DAT_00000001 < pcVar44) {
              pcVar41 = &DAT_00000001;
              pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              goto LAB_01666b18;
            }
          }
          else {
            if (bVar25 != 0x78) goto LAB_016668c9;
LAB_016669d9:
            pcVar44 = pcVar10 + ~(ulong)pcVar14;
            if (&DAT_00000001 < pcVar44) {
              pcVar41 = &DAT_00000001;
              pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              goto LAB_016669fd;
            }
          }
          IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>
                    ((IntegerDecimalCastData<unsigned_long> *)&local_128);
          break;
        }
        if (bVar25 == 0x42) goto LAB_01666afe;
        if (bVar25 == 0x58) goto LAB_016669d9;
LAB_016668c9:
        if ((byte)(bVar25 - 0x30) < 10) break;
      }
      lVar40 = -1;
      pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
      pcVar10 = (char *)0x0;
      goto LAB_016668f1;
    }
    pcVar14 = pcVar14 + 1;
  } while (pcVar10 != pcVar14);
  goto switchD_01662c6a_default;
  while( true ) {
    pcVar41 = pcVar44 + 1;
    pcVar29 = pcVar14;
    if ((((pcVar14 != pcVar41) &&
         (pcVar29 = pcVar41,
         ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar41] == '_')) &&
        ((pcVar29 = pcVar44 + 2, pcVar14 == pcVar29 ||
         ((((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar29] & 0xfe) != 0x30))))
       || (pcVar44 = pcVar29, lVar40 < 0)) goto LAB_01666845;
    lVar40 = lVar30 + lVar40 * 2;
    if (pcVar14 <= pcVar44) break;
LAB_01664b64:
    cVar24 = ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar44];
    if (cVar24 == '0') {
      lVar30 = 0;
    }
    else {
      if (cVar24 != '1') goto LAB_01666845;
      lVar30 = 1;
    }
  }
  goto LAB_01667445;
  while( true ) {
    pcVar41 = pcVar44 + 1;
    pcVar29 = pcVar14;
    if ((((pcVar14 != pcVar41) &&
         (pcVar29 = pcVar41,
         ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar41] == '_')) &&
        ((pcVar29 = pcVar44 + 2, pcVar14 == pcVar29 ||
         ((bVar25 = ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar29],
          9 < (byte)(bVar25 - 0x30) &&
          ((uVar37 = bVar25 - 0x41, 0x25 < uVar37 ||
           ((0x3f0000003fU >> ((ulong)uVar37 & 0x3f) & 1) == 0)))))))) ||
       (pcVar44 = pcVar29, ~(ulong)bVar32 >> 4 < uVar18)) goto LAB_01666845;
    uVar18 = uVar18 * 0x10 + (ulong)bVar32;
    if (pcVar14 <= pcVar44) break;
LAB_0166469c:
    bVar25 = ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar44];
    bVar34 = bVar25 | 0x20;
    if (0x19 < (byte)(bVar25 + 0xbf)) {
      bVar34 = bVar25;
    }
    bVar25 = bVar34 - 0x30;
    if ((byte)(bVar34 + 0x9f) < 6 || bVar25 < 10) {
      bVar32 = bVar34 + 0xa9;
      if (bVar34 < 0x61) {
        bVar32 = bVar25;
      }
    }
    else {
      bVar32 = bVar25;
      if (5 < (byte)(bVar34 + 0xbf)) goto LAB_01666845;
    }
  }
  goto LAB_01667445;
  while( true ) {
    if (~(ulong)bVar34 / 10 < uVar18) goto LAB_01666845;
    uVar18 = (ulong)bVar34 + uVar18 * 10;
    pBVar19 = (BaseScanner *)((long)&pBVar19->_vptr_BaseScanner + 1);
    pcVar44 = pcVar14 + lVar40;
    lVar40 = lVar40 + -1;
    if (pcVar44 == (char *)0x0) break;
LAB_01663da9:
    bVar25 = *(byte *)((long)&pBVar19[-1].bytes_read + 7);
    bVar34 = bVar25 - 0x30;
    if (9 < bVar34) {
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto LAB_01666845;
      pcVar44 = (char *)-lVar40;
      if (pcVar44 < pcVar14) goto LAB_01664d7b;
      if (lVar40 == 0) goto LAB_01666845;
      break;
    }
  }
  goto LAB_01667445;
  while( true ) {
    pcVar44 = pcVar44 + 1;
    pBVar19 = (BaseScanner *)((long)&pBVar19->_vptr_BaseScanner + 1);
    if (pcVar14 <= pcVar44) break;
LAB_01664d7b:
    if ((4 < *(byte *)&pBVar19->_vptr_BaseScanner - 9) &&
       (*(byte *)&pBVar19->_vptr_BaseScanner != 0x20)) goto LAB_01666845;
  }
  goto LAB_01667445;
joined_r0x01666955:
  if (9 < (byte)(bVar25 - 0x30)) goto LAB_01666982;
  local_128.type_._0_8_ = local_128.type_._0_8_ * 10 - (ulong)(byte)(bVar25 - 0x30);
  pcVar41 = pcVar44;
  if (pcVar44 == pcVar10) goto LAB_01666c25;
  bVar25 = pcVar14[(long)(pcVar10 + (long)(&this_02->states + -0x20))];
  pcVar10 = pcVar10 + 1;
  goto joined_r0x01666955;
LAB_01666982:
  pcVar41 = pcVar10;
  if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto switchD_01662c6a_default;
  for (; pcVar10 < pcVar44; pcVar10 = pcVar10 + 1) {
    if ((4 < (byte)pcVar14[(long)(pcVar10 + (long)(&this_02->states + -0x20))] - 9) &&
       (pcVar14[(long)(pcVar10 + (long)(&this_02->states + -0x20))] != 0x20))
    goto switchD_01662c6a_default;
    pcVar41 = pcVar44;
  }
LAB_01666c25:
  bVar45 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,true>
                     ((IntegerDecimalCastData<unsigned_long> *)&local_128);
  bVar5 = pcVar41 < (char *)0x2;
  goto LAB_01667051;
  while( true ) {
    pcVar4 = pcVar44;
    if (pcVar10 + (-2 - (long)pcVar41) != pcVar14) {
      if ((pcVar14 + 2)[(long)pcVar29] == '_') {
        if ((pcVar10 + (-3 - (long)pcVar41) == pcVar14) ||
           (((pcVar14 + 3)[(long)pcVar29] & 0xfeU) != 0x30)) goto switchD_01662c6a_default;
        pcVar4 = pcVar41 + 2;
      }
      else {
        pcVar4 = pcVar41 + 1;
      }
    }
    pcVar41 = pcVar4;
    if ((long)pp_Var21 < 0) goto switchD_01662c6a_default;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)pp_Var21 * 2 + lVar40);
    if (pcVar44 <= pcVar41) break;
LAB_01666b18:
    pcVar29 = pcVar41 + (long)this_02;
    lVar40 = 0;
    bVar5 = false;
    if ((pcVar14 + 1)[(long)pcVar29] != '0') {
      if ((pcVar14 + 1)[(long)pcVar29] != '1') goto LAB_01667445;
      lVar40 = 1;
    }
  }
  local_128.type_._0_8_ = pp_Var21;
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>
                    ((IntegerDecimalCastData<unsigned_long> *)&local_128);
  goto LAB_01666fc5;
  while( true ) {
    pcVar41 = pcVar4;
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)(~(ulong)bVar32 >> 4) < pp_Var21)
    goto switchD_01662c6a_default;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
               ((long)pp_Var21 * 0x10 + (ulong)bVar32);
    if (pcVar44 <= pcVar41) break;
LAB_016669fd:
    pcVar29 = pcVar41 + (long)this_02;
    bVar25 = (pcVar14 + 1)[(long)pcVar29];
    bVar34 = bVar25 | 0x20;
    if (0x19 < (byte)(bVar25 + 0xbf)) {
      bVar34 = bVar25;
    }
    bVar25 = bVar34 - 0x30;
    if ((byte)(bVar34 + 0x9f) < 6 || bVar25 < 10) {
      bVar32 = bVar34 + 0xa9;
      if (bVar34 < 0x61) {
        bVar32 = bVar25;
      }
    }
    else {
      bVar32 = bVar25;
      if (5 < (byte)(bVar34 + 0xbf)) goto switchD_01662c6a_default;
    }
    pcVar4 = pcVar44;
    if (pcVar10 + (-2 - (long)pcVar41) != pcVar14) {
      if ((pcVar14 + 2)[(long)pcVar29] == '_') {
        if (pcVar10 + (-3 - (long)pcVar41) == pcVar14) goto switchD_01662c6a_default;
        pcVar4 = pcVar41 + 2;
        if (9 < (byte)((pcVar14 + 3)[(long)pcVar29] - 0x30U)) {
          bVar5 = false;
          uVar37 = (byte)(pcVar14 + 3)[(long)pcVar29] - 0x41;
          if ((0x25 < uVar37) || ((0x3f0000003fU >> ((ulong)uVar37 & 0x3f) & 1) == 0))
          goto LAB_01667445;
        }
      }
      else {
        pcVar4 = pcVar41 + 1;
      }
    }
  }
  local_128.type_._0_8_ = pp_Var21;
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>
                    ((IntegerDecimalCastData<unsigned_long> *)&local_128);
  goto LAB_01666fc5;
  while( true ) {
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)(~(ulong)bVar34 / 10) < pp_Var21)
    goto switchD_01662c6a_default;
    pcVar10 = pcVar10 + 1;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((ulong)bVar34 + (long)pp_Var21 * 10);
    lVar40 = lVar40 + -1;
    if (pcVar44 == pcVar10) break;
LAB_016668f1:
    bVar25 = pcVar14[(long)(pcVar10 + (long)(&this_02->states + -0x20))];
    bVar34 = bVar25 - 0x30;
    if (9 < bVar34) {
      local_128.type_._0_8_ = pp_Var21;
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto switchD_01662c6a_default;
      pcVar41 = (char *)-lVar40;
      if (pcVar44 <= pcVar41) goto LAB_01666c0e;
      pbVar11 = (byte *)(pcVar10 + (long)(pcVar14 + (long)(&this_02->states + -0x20)));
      goto LAB_01666be9;
    }
  }
  goto LAB_01666937;
  while (pcVar41 = pcVar41 + 1, pcVar41 < pcVar44) {
LAB_01666be9:
    pbVar11 = pbVar11 + 1;
    if ((4 < *pbVar11 - 9) && (*pbVar11 != 0x20)) goto switchD_01662c6a_default;
  }
LAB_01666937:
  local_128.type_._0_8_ = pp_Var21;
  pcVar41 = &DAT_00000001;
LAB_01666c0e:
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>
                    ((IntegerDecimalCastData<unsigned_long> *)&local_128);
  goto LAB_01667032;
  while( true ) {
    pcVar44 = pcVar44 + 1;
    lVar40 = lVar40 + -1;
    pcVar41 = pcVar14;
    if (pcVar14 == pcVar44) break;
LAB_01663121:
    bVar25 = pcVar44[(long)(&pBVar8->states + -0x20)];
    if (9 < (byte)(bVar25 - 0x30)) {
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto LAB_0166644d;
      pcVar44 = (char *)-lVar40;
      pcVar41 = pcVar44;
      if (pcVar44 < pcVar14) {
        pbVar11 = (byte *)((long)pBVar8 - lVar40);
        goto LAB_01663fb7;
      }
      break;
    }
  }
  goto LAB_01663fdc;
  while( true ) {
    pcVar44 = pcVar44 + 1;
    pbVar11 = pbVar11 + 1;
    pcVar41 = pcVar14;
    if (pcVar14 <= pcVar44) break;
LAB_01663fb7:
    if ((4 < *pbVar11 - 9) && (*pbVar11 != 0x20)) goto LAB_0166644d;
  }
LAB_01663fdc:
  if ((char *)0x1 < pcVar41) goto LAB_01667445;
LAB_0166644d:
  do {
    bVar25 = *(byte *)&this_02->_vptr_BaseScanner;
    if ((4 < bVar25 - 9) && (bVar25 != 0x20)) {
      local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (bVar25 == 0x2d) {
        if (pcVar10 != &DAT_00000001) {
          pcVar14 = &DAT_00000001;
          lVar40 = -2;
          pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
          goto LAB_01666568;
        }
        IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,true>
                  ((IntegerDecimalCastData<unsigned_int> *)&local_128);
        break;
      }
      if ((pcVar10 == &DAT_00000001) || (bVar25 != 0x30)) {
        if (bVar25 == 0x2b) break;
      }
      else {
        bVar25 = *(byte *)((long)&this_02->_vptr_BaseScanner + 1);
        if (0x61 < bVar25) {
          if (bVar25 == 0x62) {
LAB_01666727:
            pcVar10 = pcVar10 + -1;
            if (&DAT_00000001 < pcVar10) {
              pcVar14 = &DAT_00000001;
              pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              goto LAB_01666745;
            }
          }
          else {
            if (bVar25 != 0x78) goto LAB_016664c5;
LAB_0166660e:
            pcVar10 = pcVar10 + -1;
            if (&DAT_00000001 < pcVar10) {
              pcVar14 = &DAT_00000001;
              pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              goto LAB_01666636;
            }
          }
          IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>
                    ((IntegerDecimalCastData<unsigned_int> *)&local_128);
          break;
        }
        if (bVar25 == 0x42) goto LAB_01666727;
        if (bVar25 == 0x58) goto LAB_0166660e;
LAB_016664c5:
        if ((byte)(bVar25 - 0x30) < 10) break;
      }
      lVar40 = -1;
      pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
      pcVar14 = (char *)0x0;
      goto LAB_016664f8;
    }
    this_02 = (BaseScanner *)((long)&this_02->_vptr_BaseScanner + 1);
    pcVar10 = pcVar10 + -1;
  } while (pcVar10 != (char *)0x0);
  goto switchD_01662c6a_default;
  while( true ) {
    pcVar41 = pcVar44 + 1;
    pcVar29 = pcVar14;
    if ((((pcVar14 != pcVar41) &&
         (pcVar29 = pcVar41,
         ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar41] == '_')) &&
        ((pcVar29 = pcVar44 + 2, pcVar14 == pcVar29 ||
         ((((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar29] & 0xfe) != 0x30))))
       || (pcVar44 = pcVar29, iVar17 < 0)) goto LAB_0166644d;
    iVar17 = iVar27 + iVar17 * 2;
    if (pcVar14 <= pcVar44) break;
LAB_01664ade:
    cVar24 = ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar44];
    iVar27 = 0;
    if (cVar24 != '0') {
      if (cVar24 != '1') goto LAB_0166644d;
      iVar27 = 1;
    }
  }
  goto LAB_01667445;
  while( true ) {
    pcVar41 = pcVar44 + 1;
    pcVar29 = pcVar14;
    if ((((pcVar14 != pcVar41) &&
         (pcVar29 = pcVar41,
         ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar41] == '_')) &&
        ((pcVar29 = pcVar44 + 2, pcVar14 == pcVar29 ||
         ((bVar25 = ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar29],
          9 < (byte)(bVar25 - 0x30) &&
          ((uVar36 = bVar25 - 0x41, 0x25 < uVar36 ||
           ((0x3f0000003fU >> ((ulong)uVar36 & 0x3f) & 1) == 0)))))))) ||
       (pcVar44 = pcVar29, ~(uint)bVar32 >> 4 < uVar37)) goto LAB_0166644d;
    uVar37 = uVar37 * 0x10 + (uint)bVar32;
    if (pcVar14 <= pcVar44) break;
LAB_0166458a:
    bVar25 = ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar44];
    bVar34 = bVar25 | 0x20;
    if (0x19 < (byte)(bVar25 + 0xbf)) {
      bVar34 = bVar25;
    }
    bVar25 = bVar34 - 0x30;
    if ((byte)(bVar34 + 0x9f) < 6 || bVar25 < 10) {
      bVar32 = bVar34 + 0xa9;
      if (bVar34 < 0x61) {
        bVar32 = bVar25;
      }
    }
    else {
      bVar32 = bVar25;
      if (5 < (byte)(bVar34 + 0xbf)) goto LAB_0166644d;
    }
  }
  goto LAB_01667445;
  while( true ) {
    if (~(uint)bVar34 / 10 < uVar37) goto LAB_0166644d;
    uVar37 = (uint)bVar34 + uVar37 * 10;
    pBVar19 = (BaseScanner *)((long)&pBVar19->_vptr_BaseScanner + 1);
    pcVar44 = pcVar14 + lVar40;
    lVar40 = lVar40 + -1;
    if (pcVar44 == (char *)0x0) break;
LAB_01663d3f:
    bVar25 = *(byte *)((long)&pBVar19[-1].bytes_read + 7);
    bVar34 = bVar25 - 0x30;
    if (9 < bVar34) {
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto LAB_0166644d;
      pcVar44 = (char *)-lVar40;
      if (pcVar44 < pcVar14) goto LAB_01664d3b;
      if (lVar40 == 0) goto LAB_0166644d;
      break;
    }
  }
  goto LAB_01667445;
  while( true ) {
    pcVar44 = pcVar44 + 1;
    pBVar19 = (BaseScanner *)((long)&pBVar19->_vptr_BaseScanner + 1);
    if (pcVar14 <= pcVar44) break;
LAB_01664d3b:
    if ((4 < *(byte *)&pBVar19->_vptr_BaseScanner - 9) &&
       (*(byte *)&pBVar19->_vptr_BaseScanner != 0x20)) goto LAB_0166644d;
  }
  goto LAB_01667445;
  while( true ) {
    uVar18 = (0x8000000000000000 - (ulong)bVar34) / 10;
    if (SBORROW8((long)pp_Var21,-uVar18) != (long)((long)pp_Var21 + uVar18) < 0)
    goto switchD_01662c6a_default;
    pcVar14 = pcVar14 + 1;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)pp_Var21 * 10 - (ulong)bVar34);
    lVar40 = lVar40 + -1;
    pcVar44 = pcVar10;
    if (pcVar10 == pcVar14) break;
LAB_01666568:
    bVar25 = pcVar14[(long)(&this_02->states + -0x20)];
    bVar34 = bVar25 - 0x30;
    if (9 < bVar34) {
      local_128.type_._0_8_ = pp_Var21;
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto switchD_01662c6a_default;
      pcVar14 = (char *)-lVar40;
      pcVar44 = pcVar14;
      if (pcVar14 < pcVar10) {
        pbVar11 = (byte *)((long)this_02 - lVar40);
        goto LAB_016665d7;
      }
      break;
    }
  }
  goto LAB_0166682d;
  while( true ) {
    pcVar14 = pcVar14 + 1;
    pbVar11 = pbVar11 + 1;
    pcVar44 = pcVar10;
    if (pcVar10 <= pcVar14) break;
LAB_016665d7:
    if ((4 < *pbVar11 - 9) && (*pbVar11 != 0x20)) goto switchD_01662c6a_default;
  }
LAB_0166682d:
  local_128.type_._0_8_ = pp_Var21;
  bVar45 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,true>
                     ((IntegerDecimalCastData<unsigned_int> *)&local_128);
  goto LAB_0166704d;
  while( true ) {
    pcVar44 = pcVar14 + 1;
    pcVar41 = pcVar10;
    if ((((pcVar10 != pcVar44) &&
         (pcVar41 = pcVar44,
         ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar44] == '_')) &&
        ((pcVar41 = pcVar14 + 2, pcVar10 == pcVar41 ||
         ((((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar41] & 0xfe) != 0x30)))
        ) || (pcVar14 = pcVar41, 0x3fffffffffffffff < (long)pp_Var21))
    goto switchD_01662c6a_default;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)pp_Var21 * 2 + lVar40);
    if (pcVar10 <= pcVar14) break;
LAB_01666745:
    cVar24 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar14];
    lVar40 = 0;
    bVar5 = false;
    if (cVar24 != '0') {
      if (cVar24 != '1') goto LAB_01667445;
      lVar40 = 1;
    }
  }
  local_128.type_._0_8_ = pp_Var21;
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>
                    ((IntegerDecimalCastData<unsigned_int> *)&local_128);
  goto LAB_01666fc5;
  while( true ) {
    pcVar14 = pcVar41;
    if ((long)((ulong)(bVar32 >> 4) ^ 0x7ffffffffffffff) < (long)pp_Var21)
    goto switchD_01662c6a_default;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
               ((long)pp_Var21 * 0x10 + (ulong)bVar32);
    if (pcVar10 <= pcVar14) break;
LAB_01666636:
    bVar25 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar14];
    bVar34 = bVar25 | 0x20;
    if (0x19 < (byte)(bVar25 + 0xbf)) {
      bVar34 = bVar25;
    }
    bVar25 = bVar34 - 0x30;
    if ((byte)(bVar34 + 0x9f) < 6 || bVar25 < 10) {
      bVar32 = bVar34 + 0xa9;
      if (bVar34 < 0x61) {
        bVar32 = bVar25;
      }
    }
    else {
      bVar32 = bVar25;
      if (5 < (byte)(bVar34 + 0xbf)) goto switchD_01662c6a_default;
    }
    pcVar44 = pcVar14 + 1;
    pcVar41 = pcVar10;
    if ((pcVar10 != pcVar44) &&
       (pcVar41 = pcVar44,
       ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar44] == '_')) {
      pcVar41 = pcVar14 + 2;
      if (pcVar10 == pcVar41) goto switchD_01662c6a_default;
      bVar25 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar41];
      if (9 < (byte)(bVar25 - 0x30)) {
        bVar5 = false;
        uVar37 = bVar25 - 0x41;
        if ((0x25 < uVar37) || ((0x3f0000003fU >> ((ulong)uVar37 & 0x3f) & 1) == 0))
        goto LAB_01667445;
      }
    }
  }
  local_128.type_._0_8_ = pp_Var21;
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>
                    ((IntegerDecimalCastData<unsigned_int> *)&local_128);
  goto LAB_01666fc5;
  while( true ) {
    if ((long)(((ulong)bVar34 ^ 0x7ffffffffffffffe) / 10) < (long)pp_Var21)
    goto switchD_01662c6a_default;
    pcVar14 = pcVar14 + 1;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((ulong)bVar34 + (long)pp_Var21 * 10);
    lVar40 = lVar40 + -1;
    if (pcVar10 == pcVar14) break;
LAB_016664f8:
    bVar25 = pcVar14[(long)(&this_02->states + -0x20)];
    bVar34 = bVar25 - 0x30;
    if (9 < bVar34) {
      local_128.type_._0_8_ = pp_Var21;
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto switchD_01662c6a_default;
      pcVar41 = (char *)-lVar40;
      if (pcVar10 <= pcVar41) goto LAB_0166681b;
      pbVar11 = (byte *)((long)this_02 - lVar40);
      goto LAB_016667f6;
    }
  }
  goto LAB_0166653b;
  while( true ) {
    pcVar41 = pcVar41 + 1;
    pbVar11 = pbVar11 + 1;
    if (pcVar10 <= pcVar41) break;
LAB_016667f6:
    if ((4 < *pbVar11 - 9) && (*pbVar11 != 0x20)) goto switchD_01662c6a_default;
  }
LAB_0166653b:
  local_128.type_._0_8_ = pp_Var21;
  pcVar41 = &DAT_00000001;
LAB_0166681b:
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>
                    ((IntegerDecimalCastData<unsigned_int> *)&local_128);
  goto LAB_01667032;
  while( true ) {
    pcVar44 = pcVar44 + 1;
    lVar40 = lVar40 + -1;
    pcVar41 = pcVar14;
    if (pcVar14 == pcVar44) break;
LAB_01662ce2:
    bVar25 = pcVar44[(long)(&pBVar8->states + -0x20)];
    if (9 < (byte)(bVar25 - 0x30)) {
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto LAB_01665863;
      pcVar44 = (char *)-lVar40;
      pcVar41 = pcVar44;
      if (pcVar44 < pcVar14) {
        pbVar11 = (byte *)((long)pBVar8 - lVar40);
        goto LAB_01663f1b;
      }
      break;
    }
  }
  goto LAB_01663f40;
  while( true ) {
    pcVar44 = pcVar44 + 1;
    pbVar11 = pbVar11 + 1;
    pcVar41 = pcVar14;
    if (pcVar14 <= pcVar44) break;
LAB_01663f1b:
    if ((4 < *pbVar11 - 9) && (*pbVar11 != 0x20)) goto LAB_01665863;
  }
LAB_01663f40:
  if ((char *)0x1 < pcVar41) goto LAB_01667445;
LAB_01665863:
  do {
    bVar25 = *(byte *)&this_02->_vptr_BaseScanner;
    if ((4 < bVar25 - 9) && (bVar25 != 0x20)) {
      local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (bVar25 == 0x2d) {
        if (pcVar10 != &DAT_00000001) {
          pcVar14 = &DAT_00000001;
          lVar40 = -2;
          pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
          goto LAB_0166597e;
        }
        IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,true>
                  ((IntegerDecimalCastData<unsigned_short> *)&local_128);
        break;
      }
      if ((pcVar10 == &DAT_00000001) || (bVar25 != 0x30)) {
        if (bVar25 == 0x2b) break;
      }
      else {
        bVar25 = *(byte *)((long)&this_02->_vptr_BaseScanner + 1);
        if (0x61 < bVar25) {
          if (bVar25 == 0x62) {
LAB_01665b3d:
            pcVar10 = pcVar10 + -1;
            if (&DAT_00000001 < pcVar10) {
              pcVar14 = &DAT_00000001;
              pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              goto LAB_01665b5b;
            }
          }
          else {
            if (bVar25 != 0x78) goto LAB_016658db;
LAB_01665a24:
            pcVar10 = pcVar10 + -1;
            if (&DAT_00000001 < pcVar10) {
              pcVar14 = &DAT_00000001;
              pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              goto LAB_01665a4c;
            }
          }
          IntegerDecimalCastOperation::
          Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>
                    ((IntegerDecimalCastData<unsigned_short> *)&local_128);
          break;
        }
        if (bVar25 == 0x42) goto LAB_01665b3d;
        if (bVar25 == 0x58) goto LAB_01665a24;
LAB_016658db:
        if ((byte)(bVar25 - 0x30) < 10) break;
      }
      lVar40 = -1;
      pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
      pcVar14 = (char *)0x0;
      goto LAB_0166590e;
    }
    this_02 = (BaseScanner *)((long)&this_02->_vptr_BaseScanner + 1);
    pcVar10 = pcVar10 + -1;
  } while (pcVar10 != (char *)0x0);
  goto switchD_01662c6a_default;
  while( true ) {
    pcVar41 = pcVar44 + 1;
    pcVar29 = pcVar14;
    if ((((pcVar14 != pcVar41) &&
         (pcVar29 = pcVar41,
         ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar41] == '_')) &&
        ((pcVar29 = pcVar44 + 2, pcVar14 == pcVar29 ||
         ((((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar29] & 0xfe) != 0x30))))
       || (pcVar44 = pcVar29, sVar16 < 0)) goto LAB_01665863;
    sVar16 = sVar26 + sVar16 * 2;
    if (pcVar14 <= pcVar44) break;
LAB_016648aa:
    cVar24 = ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar44];
    if (cVar24 == '0') {
      sVar26 = 0;
    }
    else {
      if (cVar24 != '1') goto LAB_01665863;
      sVar26 = 1;
    }
  }
  goto LAB_01667445;
  while( true ) {
    pcVar41 = pcVar44 + 1;
    pcVar29 = pcVar14;
    if ((((pcVar14 != pcVar41) &&
         (pcVar29 = pcVar41,
         ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar41] == '_')) &&
        ((pcVar29 = pcVar44 + 2, pcVar14 == pcVar29 ||
         ((bVar25 = ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar29],
          9 < (byte)(bVar25 - 0x30) &&
          ((uVar35 = bVar25 - 0x41, 0x25 < uVar35 ||
           ((0x3f0000003fU >> ((ulong)uVar35 & 0x3f) & 1) == 0)))))))) ||
       (pcVar44 = pcVar29, (uVar36 >> 4 & 0xf ^ 0xfff) < (uVar37 & 0xffff))) goto LAB_01665863;
    uVar37 = uVar37 * 0x10 + (uVar36 & 0xff);
    if (pcVar14 <= pcVar44) break;
LAB_01664106:
    bVar25 = ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar44];
    bVar34 = bVar25 | 0x20;
    if (0x19 < (byte)(bVar25 + 0xbf)) {
      bVar34 = bVar25;
    }
    uVar36 = bVar34 - 0x30;
    if ((byte)(bVar34 + 0x9f) < 6 || (byte)uVar36 < 10) {
      uVar35 = bVar34 - 0x57;
      if (bVar34 < 0x61) {
        uVar35 = uVar36;
      }
      uVar36 = uVar35 & 0xff;
    }
    else if (5 < (byte)(bVar34 + 0xbf)) goto LAB_01665863;
  }
  goto LAB_01667445;
  while( true ) {
    if ((ushort)~(ushort)bVar34 / 10 < uVar23) goto LAB_01665863;
    uVar23 = (ushort)bVar34 + uVar23 * 10;
    pBVar19 = (BaseScanner *)((long)&pBVar19->_vptr_BaseScanner + 1);
    pcVar44 = pcVar14 + lVar40;
    lVar40 = lVar40 + -1;
    if (pcVar44 == (char *)0x0) break;
LAB_01663bf4:
    bVar25 = *(byte *)((long)&pBVar19[-1].bytes_read + 7);
    bVar34 = bVar25 - 0x30;
    if (9 < bVar34) {
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto LAB_01665863;
      pcVar44 = (char *)-lVar40;
      if (pcVar44 < pcVar14) goto LAB_01664c79;
      if (lVar40 == 0) goto LAB_01665863;
      break;
    }
  }
  goto LAB_01667445;
  while( true ) {
    pcVar44 = pcVar44 + 1;
    pBVar19 = (BaseScanner *)((long)&pBVar19->_vptr_BaseScanner + 1);
    if (pcVar14 <= pcVar44) break;
LAB_01664c79:
    if ((4 < *(byte *)&pBVar19->_vptr_BaseScanner - 9) &&
       (*(byte *)&pBVar19->_vptr_BaseScanner != 0x20)) goto LAB_01665863;
  }
  goto LAB_01667445;
  while( true ) {
    uVar18 = (0x8000000000000000 - (ulong)bVar34) / 10;
    if (SBORROW8((long)pp_Var21,-uVar18) != (long)((long)pp_Var21 + uVar18) < 0)
    goto switchD_01662c6a_default;
    pcVar14 = pcVar14 + 1;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)pp_Var21 * 10 - (ulong)bVar34);
    lVar40 = lVar40 + -1;
    pcVar44 = pcVar10;
    if (pcVar10 == pcVar14) break;
LAB_0166597e:
    bVar25 = pcVar14[(long)(&this_02->states + -0x20)];
    bVar34 = bVar25 - 0x30;
    if (9 < bVar34) {
      local_128.type_._0_8_ = pp_Var21;
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto switchD_01662c6a_default;
      pcVar14 = (char *)-lVar40;
      pcVar44 = pcVar14;
      if (pcVar14 < pcVar10) {
        pbVar11 = (byte *)((long)this_02 - lVar40);
        goto LAB_016659ed;
      }
      break;
    }
  }
  goto LAB_01665c43;
  while( true ) {
    pcVar14 = pcVar14 + 1;
    pbVar11 = pbVar11 + 1;
    pcVar44 = pcVar10;
    if (pcVar10 <= pcVar14) break;
LAB_016659ed:
    if ((4 < *pbVar11 - 9) && (*pbVar11 != 0x20)) goto switchD_01662c6a_default;
  }
LAB_01665c43:
  local_128.type_._0_8_ = pp_Var21;
  bVar45 = IntegerDecimalCastOperation::
           Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,true>
                     ((IntegerDecimalCastData<unsigned_short> *)&local_128);
  goto LAB_0166704d;
  while( true ) {
    pcVar44 = pcVar14 + 1;
    pcVar41 = pcVar10;
    if ((((pcVar10 != pcVar44) &&
         (pcVar41 = pcVar44,
         ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar44] == '_')) &&
        ((pcVar41 = pcVar14 + 2, pcVar10 == pcVar41 ||
         ((((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar41] & 0xfe) != 0x30)))
        ) || (pcVar14 = pcVar41, 0x3fffffffffffffff < (long)pp_Var21))
    goto switchD_01662c6a_default;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)pp_Var21 * 2 + lVar40);
    if (pcVar10 <= pcVar14) break;
LAB_01665b5b:
    cVar24 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar14];
    lVar40 = 0;
    bVar5 = false;
    if (cVar24 != '0') {
      if (cVar24 != '1') goto LAB_01667445;
      lVar40 = 1;
    }
  }
  local_128.type_._0_8_ = pp_Var21;
  bVar5 = IntegerDecimalCastOperation::
          Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>
                    ((IntegerDecimalCastData<unsigned_short> *)&local_128);
  goto LAB_01666fc5;
  while( true ) {
    pcVar14 = pcVar41;
    if ((long)((ulong)(bVar32 >> 4) ^ 0x7ffffffffffffff) < (long)pp_Var21)
    goto switchD_01662c6a_default;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
               ((long)pp_Var21 * 0x10 + (ulong)bVar32);
    if (pcVar10 <= pcVar14) break;
LAB_01665a4c:
    bVar25 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar14];
    bVar34 = bVar25 | 0x20;
    if (0x19 < (byte)(bVar25 + 0xbf)) {
      bVar34 = bVar25;
    }
    bVar25 = bVar34 - 0x30;
    if ((byte)(bVar34 + 0x9f) < 6 || bVar25 < 10) {
      bVar32 = bVar34 + 0xa9;
      if (bVar34 < 0x61) {
        bVar32 = bVar25;
      }
    }
    else {
      bVar32 = bVar25;
      if (5 < (byte)(bVar34 + 0xbf)) goto switchD_01662c6a_default;
    }
    pcVar44 = pcVar14 + 1;
    pcVar41 = pcVar10;
    if ((pcVar10 != pcVar44) &&
       (pcVar41 = pcVar44,
       ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar44] == '_')) {
      pcVar41 = pcVar14 + 2;
      if (pcVar10 == pcVar41) goto switchD_01662c6a_default;
      bVar25 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar41];
      if (9 < (byte)(bVar25 - 0x30)) {
        bVar5 = false;
        uVar37 = bVar25 - 0x41;
        if ((0x25 < uVar37) || ((0x3f0000003fU >> ((ulong)uVar37 & 0x3f) & 1) == 0))
        goto LAB_01667445;
      }
    }
  }
  local_128.type_._0_8_ = pp_Var21;
  bVar5 = IntegerDecimalCastOperation::
          Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>
                    ((IntegerDecimalCastData<unsigned_short> *)&local_128);
  goto LAB_01666fc5;
  while( true ) {
    if ((long)(((ulong)bVar34 ^ 0x7ffffffffffffffe) / 10) < (long)pp_Var21)
    goto switchD_01662c6a_default;
    pcVar14 = pcVar14 + 1;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((ulong)bVar34 + (long)pp_Var21 * 10);
    lVar40 = lVar40 + -1;
    if (pcVar10 == pcVar14) break;
LAB_0166590e:
    bVar25 = pcVar14[(long)(&this_02->states + -0x20)];
    bVar34 = bVar25 - 0x30;
    if (9 < bVar34) {
      local_128.type_._0_8_ = pp_Var21;
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto switchD_01662c6a_default;
      pcVar41 = (char *)-lVar40;
      if (pcVar10 <= pcVar41) goto LAB_01665c31;
      pbVar11 = (byte *)((long)this_02 - lVar40);
      goto LAB_01665c0c;
    }
  }
  goto LAB_01665951;
  while( true ) {
    pcVar41 = pcVar41 + 1;
    pbVar11 = pbVar11 + 1;
    if (pcVar10 <= pcVar41) break;
LAB_01665c0c:
    if ((4 < *pbVar11 - 9) && (*pbVar11 != 0x20)) goto switchD_01662c6a_default;
  }
LAB_01665951:
  local_128.type_._0_8_ = pp_Var21;
  pcVar41 = &DAT_00000001;
LAB_01665c31:
  bVar5 = IntegerDecimalCastOperation::
          Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>
                    ((IntegerDecimalCastData<unsigned_short> *)&local_128);
  goto LAB_01667032;
  while( true ) {
    pcVar44 = pcVar44 + 1;
    lVar40 = lVar40 + -1;
    pcVar41 = pcVar14;
    if (pcVar14 == pcVar44) break;
LAB_01662dd1:
    bVar25 = pcVar44[(long)(&pBVar8->states + -0x20)];
    if (9 < (byte)(bVar25 - 0x30)) {
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto LAB_01665c5c;
      pcVar44 = (char *)-lVar40;
      pcVar41 = pcVar44;
      if (pcVar44 < pcVar14) {
        pbVar11 = (byte *)((long)pBVar8 - lVar40);
        goto LAB_01663f69;
      }
      break;
    }
  }
  goto LAB_01663f8e;
  while( true ) {
    pcVar44 = pcVar44 + 1;
    pbVar11 = pbVar11 + 1;
    pcVar41 = pcVar14;
    if (pcVar14 <= pcVar44) break;
LAB_01663f69:
    if ((4 < *pbVar11 - 9) && (*pbVar11 != 0x20)) goto LAB_01665c5c;
  }
LAB_01663f8e:
  if ((char *)0x1 < pcVar41) goto LAB_01667445;
LAB_01665c5c:
  do {
    bVar25 = *(byte *)&this_02->_vptr_BaseScanner;
    if ((4 < bVar25 - 9) && (bVar25 != 0x20)) {
      local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (bVar25 == 0x2d) {
        if (pcVar10 != &DAT_00000001) {
          pcVar14 = &DAT_00000001;
          lVar40 = -2;
          pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
          goto LAB_01665d77;
        }
        IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,true>
                  ((IntegerDecimalCastData<unsigned_char> *)&local_128);
        break;
      }
      if ((pcVar10 == &DAT_00000001) || (bVar25 != 0x30)) {
        if (bVar25 == 0x2b) break;
      }
      else {
        bVar25 = *(byte *)((long)&this_02->_vptr_BaseScanner + 1);
        if (0x61 < bVar25) {
          if (bVar25 == 0x62) {
LAB_01665f36:
            pcVar10 = pcVar10 + -1;
            if (&DAT_00000001 < pcVar10) {
              pcVar14 = &DAT_00000001;
              pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              goto LAB_01665f54;
            }
          }
          else {
            if (bVar25 != 0x78) goto LAB_01665cd4;
LAB_01665e1d:
            pcVar10 = pcVar10 + -1;
            if (&DAT_00000001 < pcVar10) {
              pcVar14 = &DAT_00000001;
              pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              goto LAB_01665e45;
            }
          }
          IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>
                    ((IntegerDecimalCastData<unsigned_char> *)&local_128);
          break;
        }
        if (bVar25 == 0x42) goto LAB_01665f36;
        if (bVar25 == 0x58) goto LAB_01665e1d;
LAB_01665cd4:
        if ((byte)(bVar25 - 0x30) < 10) break;
      }
      lVar40 = -1;
      pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
      pcVar14 = (char *)0x0;
      goto LAB_01665d07;
    }
    this_02 = (BaseScanner *)((long)&this_02->_vptr_BaseScanner + 1);
    pcVar10 = pcVar10 + -1;
  } while (pcVar10 != (char *)0x0);
  goto switchD_01662c6a_default;
  while( true ) {
    pcVar41 = pcVar44 + 1;
    pcVar29 = pcVar14;
    if ((((pcVar14 != pcVar41) &&
         (pcVar29 = pcVar41,
         ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar41] == '_')) &&
        ((pcVar29 = pcVar44 + 2, pcVar14 == pcVar29 ||
         ((((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar29] & 0xfe) != 0x30))))
       || (pcVar44 = pcVar29, (char)bVar25 < '\0')) goto LAB_01665c5c;
    bVar25 = bVar25 * '\x02' | bVar34;
    if (pcVar14 <= pcVar44) break;
LAB_0166492f:
    cVar24 = ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar44];
    if (cVar24 == '0') {
      bVar34 = 0;
    }
    else {
      if (cVar24 != '1') goto LAB_01665c5c;
      bVar34 = 1;
    }
  }
  goto LAB_01667445;
  while( true ) {
    pcVar41 = pcVar44 + 1;
    pcVar29 = pcVar14;
    if ((((pcVar14 != pcVar41) &&
         (pcVar29 = pcVar41,
         ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar41] == '_')) &&
        ((pcVar29 = pcVar44 + 2, pcVar14 == pcVar29 ||
         ((bVar34 = ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar29],
          9 < (byte)(bVar34 - 0x30) &&
          ((uVar37 = bVar34 - 0x41, 0x25 < uVar37 ||
           ((0x3f0000003fU >> ((ulong)uVar37 & 0x3f) & 1) == 0)))))))) ||
       (pcVar44 = pcVar29, (byte)~bVar3 >> 4 < bVar25)) goto LAB_01665c5c;
    bVar25 = bVar3 + bVar25 * '\x10';
    if (pcVar14 <= pcVar44) break;
LAB_01664223:
    bVar34 = ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar44];
    bVar32 = bVar34 | 0x20;
    if (0x19 < (byte)(bVar34 + 0xbf)) {
      bVar32 = bVar34;
    }
    bVar34 = bVar32 - 0x30;
    if ((byte)(bVar32 + 0x9f) < 6 || bVar34 < 10) {
      bVar3 = bVar32 + 0xa9;
      if (bVar32 < 0x61) {
        bVar3 = bVar34;
      }
    }
    else {
      bVar3 = bVar34;
      if (5 < (byte)(bVar32 + 0xbf)) goto LAB_01665c5c;
    }
  }
  goto LAB_01667445;
  while( true ) {
    if ((byte)(0x2f - bVar34) / 10 < bVar25) goto LAB_01665c5c;
    bVar25 = (bVar34 - 0x30) + bVar25 * '\n';
    pBVar19 = (BaseScanner *)((long)&pBVar19->_vptr_BaseScanner + 1);
    pcVar44 = pcVar14 + lVar40;
    lVar40 = lVar40 + -1;
    if (pcVar44 == (char *)0x0) break;
LAB_01663c60:
    bVar34 = *(byte *)((long)&pBVar19[-1].bytes_read + 7);
    if (9 < (byte)(bVar34 - 0x30)) {
      if ((4 < bVar34 - 9) && (bVar34 != 0x20)) goto LAB_01665c5c;
      pcVar44 = (char *)-lVar40;
      if (pcVar44 < pcVar14) goto LAB_01664cba;
      if (lVar40 == 0) goto LAB_01665c5c;
      break;
    }
  }
  goto LAB_01667445;
  while( true ) {
    pcVar44 = pcVar44 + 1;
    pBVar19 = (BaseScanner *)((long)&pBVar19->_vptr_BaseScanner + 1);
    if (pcVar14 <= pcVar44) break;
LAB_01664cba:
    if ((4 < *(byte *)&pBVar19->_vptr_BaseScanner - 9) &&
       (*(byte *)&pBVar19->_vptr_BaseScanner != 0x20)) goto LAB_01665c5c;
  }
  goto LAB_01667445;
  while( true ) {
    uVar18 = (0x8000000000000000 - (ulong)bVar34) / 10;
    if (SBORROW8((long)pp_Var21,-uVar18) != (long)((long)pp_Var21 + uVar18) < 0)
    goto switchD_01662c6a_default;
    pcVar14 = pcVar14 + 1;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)pp_Var21 * 10 - (ulong)bVar34);
    lVar40 = lVar40 + -1;
    pcVar44 = pcVar10;
    if (pcVar10 == pcVar14) break;
LAB_01665d77:
    bVar25 = pcVar14[(long)(&this_02->states + -0x20)];
    bVar34 = bVar25 - 0x30;
    if (9 < bVar34) {
      local_128.type_._0_8_ = pp_Var21;
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto switchD_01662c6a_default;
      pcVar14 = (char *)-lVar40;
      pcVar44 = pcVar14;
      if (pcVar14 < pcVar10) {
        pbVar11 = (byte *)((long)this_02 - lVar40);
        goto LAB_01665de6;
      }
      break;
    }
  }
  goto LAB_0166603c;
  while( true ) {
    pcVar14 = pcVar14 + 1;
    pbVar11 = pbVar11 + 1;
    pcVar44 = pcVar10;
    if (pcVar10 <= pcVar14) break;
LAB_01665de6:
    if ((4 < *pbVar11 - 9) && (*pbVar11 != 0x20)) goto switchD_01662c6a_default;
  }
LAB_0166603c:
  local_128.type_._0_8_ = pp_Var21;
  bVar45 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,true>
                     ((IntegerDecimalCastData<unsigned_char> *)&local_128);
  goto LAB_0166704d;
  while( true ) {
    pcVar44 = pcVar14 + 1;
    pcVar41 = pcVar10;
    if ((((pcVar10 != pcVar44) &&
         (pcVar41 = pcVar44,
         ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar44] == '_')) &&
        ((pcVar41 = pcVar14 + 2, pcVar10 == pcVar41 ||
         ((((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar41] & 0xfe) != 0x30)))
        ) || (pcVar14 = pcVar41, 0x3fffffffffffffff < (long)pp_Var21))
    goto switchD_01662c6a_default;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)pp_Var21 * 2 + lVar40);
    if (pcVar10 <= pcVar14) break;
LAB_01665f54:
    cVar24 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar14];
    lVar40 = 0;
    bVar5 = false;
    if (cVar24 != '0') {
      if (cVar24 != '1') goto LAB_01667445;
      lVar40 = 1;
    }
  }
  local_128.type_._0_8_ = pp_Var21;
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>
                    ((IntegerDecimalCastData<unsigned_char> *)&local_128);
  goto LAB_01666fc5;
  while( true ) {
    pcVar14 = pcVar41;
    if ((long)((ulong)(bVar32 >> 4) ^ 0x7ffffffffffffff) < (long)pp_Var21)
    goto switchD_01662c6a_default;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
               ((long)pp_Var21 * 0x10 + (ulong)bVar32);
    if (pcVar10 <= pcVar14) break;
LAB_01665e45:
    bVar25 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar14];
    bVar34 = bVar25 | 0x20;
    if (0x19 < (byte)(bVar25 + 0xbf)) {
      bVar34 = bVar25;
    }
    bVar25 = bVar34 - 0x30;
    if ((byte)(bVar34 + 0x9f) < 6 || bVar25 < 10) {
      bVar32 = bVar34 + 0xa9;
      if (bVar34 < 0x61) {
        bVar32 = bVar25;
      }
    }
    else {
      bVar32 = bVar25;
      if (5 < (byte)(bVar34 + 0xbf)) goto switchD_01662c6a_default;
    }
    pcVar44 = pcVar14 + 1;
    pcVar41 = pcVar10;
    if ((pcVar10 != pcVar44) &&
       (pcVar41 = pcVar44,
       ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar44] == '_')) {
      pcVar41 = pcVar14 + 2;
      if (pcVar10 == pcVar41) goto switchD_01662c6a_default;
      bVar25 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar41];
      if (9 < (byte)(bVar25 - 0x30)) {
        bVar5 = false;
        uVar37 = bVar25 - 0x41;
        if ((0x25 < uVar37) || ((0x3f0000003fU >> ((ulong)uVar37 & 0x3f) & 1) == 0))
        goto LAB_01667445;
      }
    }
  }
  local_128.type_._0_8_ = pp_Var21;
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>
                    ((IntegerDecimalCastData<unsigned_char> *)&local_128);
  goto LAB_01666fc5;
  while( true ) {
    if ((long)(((ulong)bVar34 ^ 0x7ffffffffffffffe) / 10) < (long)pp_Var21)
    goto switchD_01662c6a_default;
    pcVar14 = pcVar14 + 1;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((ulong)bVar34 + (long)pp_Var21 * 10);
    lVar40 = lVar40 + -1;
    if (pcVar10 == pcVar14) break;
LAB_01665d07:
    bVar25 = pcVar14[(long)(&this_02->states + -0x20)];
    bVar34 = bVar25 - 0x30;
    if (9 < bVar34) {
      local_128.type_._0_8_ = pp_Var21;
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto switchD_01662c6a_default;
      pcVar41 = (char *)-lVar40;
      if (pcVar10 <= pcVar41) goto LAB_0166602a;
      pbVar11 = (byte *)((long)this_02 - lVar40);
      goto LAB_01666005;
    }
  }
  goto LAB_01665d4a;
  while( true ) {
    pcVar41 = pcVar41 + 1;
    pbVar11 = pbVar11 + 1;
    if (pcVar10 <= pcVar41) break;
LAB_01666005:
    if ((4 < *pbVar11 - 9) && (*pbVar11 != 0x20)) goto switchD_01662c6a_default;
  }
LAB_01665d4a:
  local_128.type_._0_8_ = pp_Var21;
  pcVar41 = &DAT_00000001;
LAB_0166602a:
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>
                    ((IntegerDecimalCastData<unsigned_char> *)&local_128);
  goto LAB_01667032;
  while( true ) {
    uVar18 = (0x8000000000000000 - (ulong)bVar34) / 10;
    if (SBORROW8(lVar30,-uVar18) != (long)(lVar30 + uVar18) < 0) goto LAB_01666054;
    pcVar44 = pcVar44 + 1;
    lVar30 = lVar30 * 10 - (ulong)bVar34;
    lVar40 = lVar40 + -1;
    pcVar41 = pcVar14;
    if (pcVar14 == pcVar44) break;
LAB_01662f5a:
    bVar25 = pcVar44[(long)(&pBVar8->states + -0x20)];
    bVar34 = bVar25 - 0x30;
    if (9 < bVar34) {
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto LAB_01666054;
      pcVar44 = (char *)-lVar40;
      pcVar41 = pcVar44;
      if (pcVar44 < pcVar14) {
        pbVar11 = (byte *)((long)pBVar8 - lVar40);
        goto LAB_01664053;
      }
      break;
    }
  }
  goto LAB_01664078;
  while( true ) {
    pcVar44 = pcVar44 + 1;
    pbVar11 = pbVar11 + 1;
    pcVar41 = pcVar14;
    if (pcVar14 <= pcVar44) break;
LAB_01664053:
    if ((4 < *pbVar11 - 9) && (*pbVar11 != 0x20)) goto LAB_01666054;
  }
LAB_01664078:
  if ((char *)0x1 < pcVar41) goto LAB_01667445;
LAB_01666054:
  do {
    bVar25 = *(byte *)&this_02->_vptr_BaseScanner;
    if ((4 < bVar25 - 9) && (bVar25 != 0x20)) {
      local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (bVar25 == 0x2d) {
        if (pcVar10 != &DAT_00000001) {
          pcVar14 = &DAT_00000001;
          lVar40 = -2;
          pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
          goto LAB_0166616f;
        }
        IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,true>
                  ((IntegerDecimalCastData<long> *)&local_128);
        break;
      }
      if ((pcVar10 == &DAT_00000001) || (bVar25 != 0x30)) {
        if (bVar25 == 0x2b) break;
      }
      else {
        bVar25 = *(byte *)((long)&this_02->_vptr_BaseScanner + 1);
        if (0x61 < bVar25) {
          if (bVar25 == 0x62) {
LAB_0166632e:
            pcVar10 = pcVar10 + -1;
            if (&DAT_00000001 < pcVar10) {
              pcVar14 = &DAT_00000001;
              pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              goto LAB_0166634c;
            }
          }
          else {
            if (bVar25 != 0x78) goto LAB_016660cc;
LAB_01666215:
            pcVar10 = pcVar10 + -1;
            if (&DAT_00000001 < pcVar10) {
              pcVar14 = &DAT_00000001;
              pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              goto LAB_0166623d;
            }
          }
          IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                    ((IntegerDecimalCastData<long> *)&local_128);
          break;
        }
        if (bVar25 == 0x42) goto LAB_0166632e;
        if (bVar25 == 0x58) goto LAB_01666215;
LAB_016660cc:
        if ((byte)(bVar25 - 0x30) < 10) break;
      }
      lVar40 = -1;
      pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
      pcVar14 = (char *)0x0;
      goto LAB_016660ff;
    }
    this_02 = (BaseScanner *)((long)&this_02->_vptr_BaseScanner + 1);
    pcVar10 = pcVar10 + -1;
  } while (pcVar10 != (char *)0x0);
  goto switchD_01662c6a_default;
  while( true ) {
    pcVar41 = pcVar44 + 1;
    pcVar29 = pcVar14;
    if ((((pcVar14 != pcVar41) &&
         (pcVar29 = pcVar41,
         ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar41] == '_')) &&
        ((pcVar29 = pcVar44 + 2, pcVar14 == pcVar29 ||
         ((((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar29] & 0xfe) != 0x30))))
       || (pcVar44 = pcVar29, 0x3fffffffffffffff < lVar40)) goto LAB_01666054;
    lVar40 = lVar30 + lVar40 * 2;
    if (pcVar14 <= pcVar44) break;
LAB_01664a55:
    cVar24 = ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar44];
    if (cVar24 == '0') {
      lVar30 = 0;
    }
    else {
      if (cVar24 != '1') goto LAB_01666054;
      lVar30 = 1;
    }
  }
  goto LAB_01667445;
  while( true ) {
    pcVar41 = pcVar44 + 1;
    pcVar29 = pcVar14;
    if ((((pcVar14 != pcVar41) &&
         (pcVar29 = pcVar41,
         ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar41] == '_')) &&
        ((pcVar29 = pcVar44 + 2, pcVar14 == pcVar29 ||
         ((bVar34 = ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar29],
          9 < (byte)(bVar34 - 0x30) &&
          ((uVar37 = bVar34 - 0x41, 0x25 < uVar37 ||
           ((0x3f0000003fU >> ((ulong)uVar37 & 0x3f) & 1) == 0)))))))) ||
       (pcVar44 = pcVar29, (long)((ulong)(bVar25 >> 4) ^ 0x7ffffffffffffff) < lVar40))
    goto LAB_01666054;
    lVar40 = lVar40 * 0x10 + (ulong)bVar25;
    if (pcVar14 <= pcVar44) break;
LAB_01664476:
    bVar25 = ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar44];
    bVar34 = bVar25 | 0x20;
    if (0x19 < (byte)(bVar25 + 0xbf)) {
      bVar34 = bVar25;
    }
    if ((byte)(bVar34 + 0x9f) < 6 || (byte)(bVar34 - 0x30) < 10) {
      bVar25 = bVar34 + 0xa9;
      if (bVar34 < 0x61) {
        bVar25 = bVar34 - 0x30;
      }
    }
    else {
      bVar25 = bVar34 - 0x30;
      if (5 < (byte)(bVar34 + 0xbf)) goto LAB_01666054;
    }
  }
  goto LAB_01667445;
  while( true ) {
    if ((long)(((ulong)bVar34 ^ 0x7ffffffffffffffe) / 10) < lVar40) goto LAB_01666054;
    lVar40 = (ulong)bVar34 + lVar40 * 10;
    pBVar19 = (BaseScanner *)((long)&pBVar19->_vptr_BaseScanner + 1);
    pcVar44 = pcVar14 + lVar30;
    lVar30 = lVar30 + -1;
    if (pcVar44 == (char *)0x0) break;
LAB_01663cdd:
    bVar25 = *(byte *)((long)&pBVar19[-1].bytes_read + 7);
    bVar34 = bVar25 - 0x30;
    if (9 < bVar34) {
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto LAB_01666054;
      pcVar44 = (char *)-lVar30;
      if (pcVar44 < pcVar14) goto LAB_01664cfa;
      if (lVar30 == 0) goto LAB_01666054;
      break;
    }
  }
  goto LAB_01667445;
  while( true ) {
    pcVar44 = pcVar44 + 1;
    pBVar19 = (BaseScanner *)((long)&pBVar19->_vptr_BaseScanner + 1);
    if (pcVar14 <= pcVar44) break;
LAB_01664cfa:
    if ((4 < *(byte *)&pBVar19->_vptr_BaseScanner - 9) &&
       (*(byte *)&pBVar19->_vptr_BaseScanner != 0x20)) goto LAB_01666054;
  }
  goto LAB_01667445;
  while( true ) {
    uVar18 = (0x8000000000000000 - (ulong)bVar34) / 10;
    if (SBORROW8((long)pp_Var21,-uVar18) != (long)((long)pp_Var21 + uVar18) < 0)
    goto switchD_01662c6a_default;
    pcVar14 = pcVar14 + 1;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)pp_Var21 * 10 - (ulong)bVar34);
    lVar40 = lVar40 + -1;
    pcVar44 = pcVar10;
    if (pcVar10 == pcVar14) break;
LAB_0166616f:
    bVar25 = pcVar14[(long)(&this_02->states + -0x20)];
    bVar34 = bVar25 - 0x30;
    if (9 < bVar34) {
      local_128.type_._0_8_ = pp_Var21;
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto switchD_01662c6a_default;
      pcVar14 = (char *)-lVar40;
      pcVar44 = pcVar14;
      if (pcVar14 < pcVar10) {
        pbVar11 = (byte *)((long)this_02 - lVar40);
        goto LAB_016661de;
      }
      break;
    }
  }
  goto LAB_01666434;
  while( true ) {
    pcVar14 = pcVar14 + 1;
    pbVar11 = pbVar11 + 1;
    pcVar44 = pcVar10;
    if (pcVar10 <= pcVar14) break;
LAB_016661de:
    if ((4 < *pbVar11 - 9) && (*pbVar11 != 0x20)) goto switchD_01662c6a_default;
  }
LAB_01666434:
  local_128.type_._0_8_ = pp_Var21;
  bVar45 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,true>
                     ((IntegerDecimalCastData<long> *)&local_128);
  goto LAB_0166704d;
  while( true ) {
    pcVar44 = pcVar14 + 1;
    pcVar41 = pcVar10;
    if ((((pcVar10 != pcVar44) &&
         (pcVar41 = pcVar44,
         ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar44] == '_')) &&
        ((pcVar41 = pcVar14 + 2, pcVar10 == pcVar41 ||
         ((((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar41] & 0xfe) != 0x30)))
        ) || (pcVar14 = pcVar41, 0x3fffffffffffffff < (long)pp_Var21))
    goto switchD_01662c6a_default;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)pp_Var21 * 2 + lVar40);
    if (pcVar10 <= pcVar14) break;
LAB_0166634c:
    cVar24 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar14];
    lVar40 = 0;
    bVar5 = false;
    if (cVar24 != '0') {
      if (cVar24 != '1') goto LAB_01667445;
      lVar40 = 1;
    }
  }
  local_128.type_._0_8_ = pp_Var21;
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                    ((IntegerDecimalCastData<long> *)&local_128);
  goto LAB_01666fc5;
  while( true ) {
    pcVar14 = pcVar41;
    if ((long)((ulong)(bVar32 >> 4) ^ 0x7ffffffffffffff) < (long)pp_Var21)
    goto switchD_01662c6a_default;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
               ((long)pp_Var21 * 0x10 + (ulong)bVar32);
    if (pcVar10 <= pcVar14) break;
LAB_0166623d:
    bVar25 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar14];
    bVar34 = bVar25 | 0x20;
    if (0x19 < (byte)(bVar25 + 0xbf)) {
      bVar34 = bVar25;
    }
    bVar25 = bVar34 - 0x30;
    if ((byte)(bVar34 + 0x9f) < 6 || bVar25 < 10) {
      bVar32 = bVar34 + 0xa9;
      if (bVar34 < 0x61) {
        bVar32 = bVar25;
      }
    }
    else {
      bVar32 = bVar25;
      if (5 < (byte)(bVar34 + 0xbf)) goto switchD_01662c6a_default;
    }
    pcVar44 = pcVar14 + 1;
    pcVar41 = pcVar10;
    if ((pcVar10 != pcVar44) &&
       (pcVar41 = pcVar44,
       ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar44] == '_')) {
      pcVar41 = pcVar14 + 2;
      if (pcVar10 == pcVar41) goto switchD_01662c6a_default;
      bVar25 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar41];
      if (9 < (byte)(bVar25 - 0x30)) {
        bVar5 = false;
        uVar37 = bVar25 - 0x41;
        if ((0x25 < uVar37) || ((0x3f0000003fU >> ((ulong)uVar37 & 0x3f) & 1) == 0))
        goto LAB_01667445;
      }
    }
  }
  local_128.type_._0_8_ = pp_Var21;
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                    ((IntegerDecimalCastData<long> *)&local_128);
  goto LAB_01666fc5;
  while( true ) {
    if ((long)(((ulong)bVar34 ^ 0x7ffffffffffffffe) / 10) < (long)pp_Var21)
    goto switchD_01662c6a_default;
    pcVar14 = pcVar14 + 1;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((ulong)bVar34 + (long)pp_Var21 * 10);
    lVar40 = lVar40 + -1;
    if (pcVar10 == pcVar14) break;
LAB_016660ff:
    bVar25 = pcVar14[(long)(&this_02->states + -0x20)];
    bVar34 = bVar25 - 0x30;
    if (9 < bVar34) {
      local_128.type_._0_8_ = pp_Var21;
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto switchD_01662c6a_default;
      pcVar41 = (char *)-lVar40;
      if (pcVar10 <= pcVar41) goto LAB_01666422;
      pbVar11 = (byte *)((long)this_02 - lVar40);
      goto LAB_016663fd;
    }
  }
  goto LAB_01666142;
  while( true ) {
    pcVar41 = pcVar41 + 1;
    pbVar11 = pbVar11 + 1;
    if (pcVar10 <= pcVar41) break;
LAB_016663fd:
    if ((4 < *pbVar11 - 9) && (*pbVar11 != 0x20)) goto switchD_01662c6a_default;
  }
LAB_01666142:
  local_128.type_._0_8_ = pp_Var21;
  pcVar41 = &DAT_00000001;
LAB_01666422:
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                    ((IntegerDecimalCastData<long> *)&local_128);
  goto LAB_01667032;
  while( true ) {
    uVar37 = (0x80000000 - bVar34) / 10;
    if (SBORROW4(iVar17,-uVar37) != (int)(iVar17 + uVar37) < 0) goto LAB_01666c4f;
    pcVar44 = pcVar44 + 1;
    iVar17 = iVar17 * 10 - (uint)bVar34;
    lVar40 = lVar40 + -1;
    pcVar41 = pcVar14;
    if (pcVar14 == pcVar44) break;
LAB_016632c2:
    bVar25 = pcVar44[(long)(&pBVar8->states + -0x20)];
    bVar34 = bVar25 - 0x30;
    if (9 < bVar34) {
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto LAB_01666c4f;
      pcVar44 = (char *)-lVar40;
      pcVar41 = pcVar44;
      if (pcVar44 < pcVar14) {
        pbVar11 = (byte *)((long)pBVar8 - lVar40);
        goto LAB_016640a2;
      }
      break;
    }
  }
  goto LAB_016640c7;
  while( true ) {
    pcVar44 = pcVar44 + 1;
    pbVar11 = pbVar11 + 1;
    pcVar41 = pcVar14;
    if (pcVar14 <= pcVar44) break;
LAB_016640a2:
    if ((4 < *pbVar11 - 9) && (*pbVar11 != 0x20)) goto LAB_01666c4f;
  }
LAB_016640c7:
  if ((char *)0x1 < pcVar41) goto LAB_01667445;
LAB_01666c4f:
  do {
    bVar25 = *(byte *)&this_02->_vptr_BaseScanner;
    if ((4 < bVar25 - 9) && (bVar25 != 0x20)) {
      local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (bVar25 == 0x2d) {
        if (pcVar10 != &DAT_00000001) {
          pcVar14 = &DAT_00000001;
          lVar40 = -2;
          pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
          goto LAB_01666d6a;
        }
        IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,true>
                  ((IntegerDecimalCastData<int> *)&local_128);
        break;
      }
      if ((pcVar10 == &DAT_00000001) || (bVar25 != 0x30)) {
        if (bVar25 == 0x2b) break;
      }
      else {
        bVar25 = *(byte *)((long)&this_02->_vptr_BaseScanner + 1);
        if (0x61 < bVar25) {
          if (bVar25 == 0x62) {
LAB_01666f29:
            pcVar10 = pcVar10 + -1;
            if (&DAT_00000001 < pcVar10) {
              pcVar14 = &DAT_00000001;
              pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              goto LAB_01666f47;
            }
          }
          else {
            if (bVar25 != 0x78) goto LAB_01666cc7;
LAB_01666e10:
            pcVar10 = pcVar10 + -1;
            if (&DAT_00000001 < pcVar10) {
              pcVar14 = &DAT_00000001;
              pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              goto LAB_01666e38;
            }
          }
          IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                    ((IntegerDecimalCastData<int> *)&local_128);
          break;
        }
        if (bVar25 == 0x42) goto LAB_01666f29;
        if (bVar25 == 0x58) goto LAB_01666e10;
LAB_01666cc7:
        if ((byte)(bVar25 - 0x30) < 10) break;
      }
      lVar40 = -1;
      pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
      pcVar14 = (char *)0x0;
      goto LAB_01666cfa;
    }
    this_02 = (BaseScanner *)((long)&this_02->_vptr_BaseScanner + 1);
    pcVar10 = pcVar10 + -1;
  } while (pcVar10 != (char *)0x0);
  goto switchD_01662c6a_default;
  while( true ) {
    pcVar41 = pcVar44 + 1;
    pcVar29 = pcVar14;
    if ((((pcVar14 != pcVar41) &&
         (pcVar29 = pcVar41,
         ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar41] == '_')) &&
        ((pcVar29 = pcVar44 + 2, pcVar14 == pcVar29 ||
         ((((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar29] & 0xfe) != 0x30))))
       || (pcVar44 = pcVar29, 0x3fffffff < iVar17)) goto LAB_01666c4f;
    iVar17 = iVar27 + iVar17 * 2;
    if (pcVar14 <= pcVar44) break;
LAB_01664be8:
    cVar24 = ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar44];
    iVar27 = 0;
    if (cVar24 != '0') {
      if (cVar24 != '1') goto LAB_01666c4f;
      iVar27 = 1;
    }
  }
  goto LAB_01667445;
  while( true ) {
    pcVar41 = pcVar44 + 1;
    pcVar29 = pcVar14;
    if ((((pcVar14 != pcVar41) &&
         (pcVar29 = pcVar41,
         ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar41] == '_')) &&
        ((pcVar29 = pcVar44 + 2, pcVar14 == pcVar29 ||
         ((bVar25 = ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar29],
          9 < (byte)(bVar25 - 0x30) &&
          ((uVar37 = bVar25 - 0x41, 0x25 < uVar37 ||
           ((0x3f0000003fU >> ((ulong)uVar37 & 0x3f) & 1) == 0)))))))) ||
       (pcVar44 = pcVar29, (int)(bVar32 >> 4 ^ 0x7ffffff) < iVar17)) goto LAB_01666c4f;
    iVar17 = iVar17 * 0x10 + (uint)bVar32;
    if (pcVar14 <= pcVar44) break;
LAB_016647b0:
    bVar25 = ((undefined1 *)((long)&pBVar8->_vptr_BaseScanner + 1))[(long)pcVar44];
    bVar34 = bVar25 | 0x20;
    if (0x19 < (byte)(bVar25 + 0xbf)) {
      bVar34 = bVar25;
    }
    bVar25 = bVar34 - 0x30;
    if ((byte)(bVar34 + 0x9f) < 6 || bVar25 < 10) {
      bVar32 = bVar34 + 0xa9;
      if (bVar34 < 0x61) {
        bVar32 = bVar25;
      }
    }
    else {
      bVar32 = bVar25;
      if (5 < (byte)(bVar34 + 0xbf)) goto LAB_01666c4f;
    }
  }
  goto LAB_01667445;
  while( true ) {
    if ((int)((bVar34 ^ 0x7ffffffe) / 10) < iVar17) goto LAB_01666c4f;
    iVar17 = (uint)bVar34 + iVar17 * 10;
    pBVar19 = (BaseScanner *)((long)&pBVar19->_vptr_BaseScanner + 1);
    pcVar44 = pcVar14 + lVar40;
    lVar40 = lVar40 + -1;
    if (pcVar44 == (char *)0x0) break;
LAB_01663e06:
    bVar25 = *(byte *)((long)&pBVar19[-1].bytes_read + 7);
    bVar34 = bVar25 - 0x30;
    if (9 < bVar34) {
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto LAB_01666c4f;
      pcVar44 = (char *)-lVar40;
      if (pcVar44 < pcVar14) goto LAB_01664dbb;
      if (lVar40 == 0) goto LAB_01666c4f;
      break;
    }
  }
  goto LAB_01667445;
  while( true ) {
    pcVar44 = pcVar44 + 1;
    pBVar19 = (BaseScanner *)((long)&pBVar19->_vptr_BaseScanner + 1);
    if (pcVar14 <= pcVar44) break;
LAB_01664dbb:
    if ((4 < *(byte *)&pBVar19->_vptr_BaseScanner - 9) &&
       (*(byte *)&pBVar19->_vptr_BaseScanner != 0x20)) goto LAB_01666c4f;
  }
  goto LAB_01667445;
  while( true ) {
    uVar18 = (0x8000000000000000 - (ulong)bVar34) / 10;
    if (SBORROW8((long)pp_Var21,-uVar18) != (long)((long)pp_Var21 + uVar18) < 0)
    goto switchD_01662c6a_default;
    pcVar14 = pcVar14 + 1;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)pp_Var21 * 10 - (ulong)bVar34);
    lVar40 = lVar40 + -1;
    pcVar44 = pcVar10;
    if (pcVar10 == pcVar14) break;
LAB_01666d6a:
    bVar25 = pcVar14[(long)(&this_02->states + -0x20)];
    bVar34 = bVar25 - 0x30;
    if (9 < bVar34) {
      local_128.type_._0_8_ = pp_Var21;
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto switchD_01662c6a_default;
      pcVar14 = (char *)-lVar40;
      pcVar44 = pcVar14;
      if (pcVar14 < pcVar10) {
        pbVar11 = (byte *)((long)this_02 - lVar40);
        goto LAB_01666dd9;
      }
      break;
    }
  }
  goto LAB_01667043;
  while( true ) {
    pcVar14 = pcVar14 + 1;
    pbVar11 = pbVar11 + 1;
    pcVar44 = pcVar10;
    if (pcVar10 <= pcVar14) break;
LAB_01666dd9:
    if ((4 < *pbVar11 - 9) && (*pbVar11 != 0x20)) goto switchD_01662c6a_default;
  }
LAB_01667043:
  local_128.type_._0_8_ = pp_Var21;
  bVar45 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,true>
                     ((IntegerDecimalCastData<int> *)&local_128);
  goto LAB_0166704d;
  while( true ) {
    pcVar44 = pcVar14 + 1;
    pcVar41 = pcVar10;
    if ((((pcVar10 != pcVar44) &&
         (pcVar41 = pcVar44,
         ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar44] == '_')) &&
        ((pcVar41 = pcVar14 + 2, pcVar10 == pcVar41 ||
         ((((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar41] & 0xfe) != 0x30)))
        ) || (pcVar14 = pcVar41, 0x3fffffffffffffff < (long)pp_Var21))
    goto switchD_01662c6a_default;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)pp_Var21 * 2 + lVar40);
    if (pcVar10 <= pcVar14) break;
LAB_01666f47:
    cVar24 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar14];
    lVar40 = 0;
    bVar5 = false;
    if (cVar24 != '0') {
      if (cVar24 != '1') goto LAB_01667445;
      lVar40 = 1;
    }
  }
  local_128.type_._0_8_ = pp_Var21;
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                    ((IntegerDecimalCastData<int> *)&local_128);
  goto LAB_01666fc5;
  while( true ) {
    pcVar14 = pcVar41;
    if ((long)((ulong)(bVar32 >> 4) ^ 0x7ffffffffffffff) < (long)pp_Var21)
    goto switchD_01662c6a_default;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
               ((long)pp_Var21 * 0x10 + (ulong)bVar32);
    if (pcVar10 <= pcVar14) break;
LAB_01666e38:
    bVar25 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar14];
    bVar34 = bVar25 | 0x20;
    if (0x19 < (byte)(bVar25 + 0xbf)) {
      bVar34 = bVar25;
    }
    bVar25 = bVar34 - 0x30;
    if ((byte)(bVar34 + 0x9f) < 6 || bVar25 < 10) {
      bVar32 = bVar34 + 0xa9;
      if (bVar34 < 0x61) {
        bVar32 = bVar25;
      }
    }
    else {
      bVar32 = bVar25;
      if (5 < (byte)(bVar34 + 0xbf)) goto switchD_01662c6a_default;
    }
    pcVar44 = pcVar14 + 1;
    pcVar41 = pcVar10;
    if ((pcVar10 != pcVar44) &&
       (pcVar41 = pcVar44,
       ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar44] == '_')) {
      pcVar41 = pcVar14 + 2;
      if (pcVar10 == pcVar41) goto switchD_01662c6a_default;
      bVar25 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar41];
      if (9 < (byte)(bVar25 - 0x30)) {
        bVar5 = false;
        uVar37 = bVar25 - 0x41;
        if ((0x25 < uVar37) || ((0x3f0000003fU >> ((ulong)uVar37 & 0x3f) & 1) == 0))
        goto LAB_01667445;
      }
    }
  }
  local_128.type_._0_8_ = pp_Var21;
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                    ((IntegerDecimalCastData<int> *)&local_128);
  goto LAB_01666fc5;
  while( true ) {
    if ((long)(((ulong)bVar34 ^ 0x7ffffffffffffffe) / 10) < (long)pp_Var21)
    goto switchD_01662c6a_default;
    pcVar14 = pcVar14 + 1;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((ulong)bVar34 + (long)pp_Var21 * 10);
    lVar40 = lVar40 + -1;
    if (pcVar10 == pcVar14) break;
LAB_01666cfa:
    bVar25 = pcVar14[(long)(&this_02->states + -0x20)];
    bVar34 = bVar25 - 0x30;
    if (9 < bVar34) {
      local_128.type_._0_8_ = pp_Var21;
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto switchD_01662c6a_default;
      pcVar41 = (char *)-lVar40;
      if (pcVar10 <= pcVar41) goto LAB_01667025;
      pbVar11 = (byte *)((long)this_02 - lVar40);
      goto LAB_01667000;
    }
  }
  goto LAB_01666d3d;
  while( true ) {
    pcVar41 = pcVar41 + 1;
    pbVar11 = pbVar11 + 1;
    if (pcVar10 <= pcVar41) break;
LAB_01667000:
    if ((4 < *pbVar11 - 9) && (*pbVar11 != 0x20)) goto switchD_01662c6a_default;
  }
LAB_01666d3d:
  local_128.type_._0_8_ = pp_Var21;
  pcVar41 = &DAT_00000001;
LAB_01667025:
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                    ((IntegerDecimalCastData<int> *)&local_128);
  goto LAB_01667032;
  while( true ) {
    pcVar4 = pcVar44;
    if (pcVar10 + (-2 - (long)pcVar41) != pcVar14) {
      if ((pcVar14 + 2)[(long)pcVar29] == '_') {
        if ((pcVar10 + (-3 - (long)pcVar41) == pcVar14) ||
           (((pcVar14 + 3)[(long)pcVar29] & 0xfeU) != 0x30)) goto LAB_0166541a;
        pcVar4 = pcVar41 + 2;
      }
      else {
        pcVar4 = pcVar41 + 1;
      }
    }
    pcVar41 = pcVar4;
    if (0x3fff < sVar16) goto LAB_0166541a;
    sVar16 = sVar26 + sVar16 * 2;
    bVar5 = true;
    if (pcVar44 <= pcVar41) break;
LAB_01663e72:
    pcVar29 = pcVar41 + (long)this_02;
    if ((pcVar14 + 1)[(long)pcVar29] == '0') {
      sVar26 = 0;
    }
    else {
      if ((pcVar14 + 1)[(long)pcVar29] != '1') goto LAB_0166541a;
      sVar26 = 1;
    }
  }
  goto LAB_01667445;
  while( true ) {
    pcVar41 = pcVar4;
    if ((short)(bVar32 >> 4 ^ 0x7ff) < sVar16) goto LAB_0166541a;
    sVar16 = sVar16 * 0x10 + (ushort)bVar32;
    bVar5 = true;
    if (pcVar44 <= pcVar41) break;
LAB_01663ae4:
    pcVar29 = pcVar41 + (long)this_02;
    bVar25 = (pcVar14 + 1)[(long)pcVar29];
    bVar34 = bVar25 | 0x20;
    if (0x19 < (byte)(bVar25 + 0xbf)) {
      bVar34 = bVar25;
    }
    bVar25 = bVar34 - 0x30;
    if ((byte)(bVar34 + 0x9f) < 6 || bVar25 < 10) {
      bVar32 = bVar34 + 0xa9;
      if (bVar34 < 0x61) {
        bVar32 = bVar25;
      }
    }
    else {
      bVar32 = bVar25;
      if (5 < (byte)(bVar34 + 0xbf)) goto LAB_0166541a;
    }
    pcVar4 = pcVar44;
    if (pcVar10 + (-2 - (long)pcVar41) != pcVar14) {
      if ((pcVar14 + 2)[(long)pcVar29] == '_') {
        if (pcVar10 + (-3 - (long)pcVar41) == pcVar14) goto LAB_0166541a;
        pcVar4 = pcVar41 + 2;
        if ((9 < (byte)((pcVar14 + 3)[(long)pcVar29] - 0x30U)) &&
           ((uVar37 = (byte)(pcVar14 + 3)[(long)pcVar29] - 0x41, 0x25 < uVar37 ||
            ((0x3f0000003fU >> ((ulong)uVar37 & 0x3f) & 1) == 0)))) goto LAB_0166541a;
      }
      else {
        pcVar4 = pcVar41 + 1;
      }
    }
  }
  goto LAB_01667445;
  while( true ) {
    uVar18 = (0x8000000000000000 - (ulong)bVar34) / 10;
    if (SBORROW8((long)pp_Var21,-uVar18) != (long)((long)pp_Var21 + uVar18) < 0)
    goto switchD_01662c6a_default;
    pcVar14 = pcVar14 + 1;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)pp_Var21 * 10 - (ulong)bVar34);
    lVar40 = lVar40 + -1;
    pcVar44 = pcVar10;
    if (pcVar10 == pcVar14) break;
LAB_01665535:
    bVar25 = pcVar14[(long)(&this_02->states + -0x20)];
    bVar34 = bVar25 - 0x30;
    if (9 < bVar34) {
      local_128.type_._0_8_ = pp_Var21;
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto switchD_01662c6a_default;
      pcVar14 = (char *)-lVar40;
      pcVar44 = pcVar14;
      if (pcVar14 < pcVar10) {
        pbVar11 = (byte *)((long)this_02 - lVar40);
        goto LAB_016655a4;
      }
      break;
    }
  }
  goto LAB_0166584b;
  while( true ) {
    pcVar14 = pcVar14 + 1;
    pbVar11 = pbVar11 + 1;
    pcVar44 = pcVar10;
    if (pcVar10 <= pcVar14) break;
LAB_016655a4:
    if ((4 < *pbVar11 - 9) && (*pbVar11 != 0x20)) goto switchD_01662c6a_default;
  }
LAB_0166584b:
  local_128.type_._0_8_ = pp_Var21;
  bVar45 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,true>
                     ((IntegerDecimalCastData<short> *)&local_128);
LAB_0166704d:
  bVar5 = pcVar44 < (char *)0x2;
  goto LAB_01667051;
  while( true ) {
    pcVar44 = pcVar14 + 1;
    pcVar41 = pcVar10;
    if ((((pcVar10 != pcVar44) &&
         (pcVar41 = pcVar44,
         ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar44] == '_')) &&
        ((pcVar41 = pcVar14 + 2, pcVar10 == pcVar41 ||
         ((((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar41] & 0xfe) != 0x30)))
        ) || (pcVar14 = pcVar41, 0x3fffffffffffffff < (long)pp_Var21))
    goto switchD_01662c6a_default;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)pp_Var21 * 2 + lVar40);
    if (pcVar10 <= pcVar14) break;
LAB_01665712:
    cVar24 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar14];
    lVar40 = 0;
    bVar5 = false;
    if (cVar24 != '0') {
      if (cVar24 != '1') goto LAB_01667445;
      lVar40 = 1;
    }
  }
  local_128.type_._0_8_ = pp_Var21;
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                    ((IntegerDecimalCastData<short> *)&local_128);
  goto LAB_01666fc5;
  while( true ) {
    pcVar14 = pcVar41;
    if ((long)((ulong)(bVar32 >> 4) ^ 0x7ffffffffffffff) < (long)pp_Var21)
    goto switchD_01662c6a_default;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
               ((long)pp_Var21 * 0x10 + (ulong)bVar32);
    if (pcVar10 <= pcVar14) break;
LAB_01665603:
    bVar25 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar14];
    bVar34 = bVar25 | 0x20;
    if (0x19 < (byte)(bVar25 + 0xbf)) {
      bVar34 = bVar25;
    }
    bVar25 = bVar34 - 0x30;
    if ((byte)(bVar34 + 0x9f) < 6 || bVar25 < 10) {
      bVar32 = bVar34 + 0xa9;
      if (bVar34 < 0x61) {
        bVar32 = bVar25;
      }
    }
    else {
      bVar32 = bVar25;
      if (5 < (byte)(bVar34 + 0xbf)) goto switchD_01662c6a_default;
    }
    pcVar44 = pcVar14 + 1;
    pcVar41 = pcVar10;
    if ((pcVar10 != pcVar44) &&
       (pcVar41 = pcVar44,
       ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar44] == '_')) {
      pcVar41 = pcVar14 + 2;
      if (pcVar10 == pcVar41) goto switchD_01662c6a_default;
      bVar25 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar41];
      if (9 < (byte)(bVar25 - 0x30)) {
        bVar5 = false;
        uVar37 = bVar25 - 0x41;
        if ((0x25 < uVar37) || ((0x3f0000003fU >> ((ulong)uVar37 & 0x3f) & 1) == 0))
        goto LAB_01667445;
      }
    }
  }
  local_128.type_._0_8_ = pp_Var21;
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                    ((IntegerDecimalCastData<short> *)&local_128);
  goto LAB_01666fc5;
  while( true ) {
    if ((long)(((ulong)bVar34 ^ 0x7ffffffffffffffe) / 10) < (long)pp_Var21)
    goto switchD_01662c6a_default;
    pcVar14 = pcVar14 + 1;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((ulong)bVar34 + (long)pp_Var21 * 10);
    lVar40 = lVar40 + -1;
    if (pcVar10 == pcVar14) break;
LAB_016654c5:
    bVar25 = pcVar14[(long)(&this_02->states + -0x20)];
    bVar34 = bVar25 - 0x30;
    if (9 < bVar34) {
      local_128.type_._0_8_ = pp_Var21;
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto switchD_01662c6a_default;
      pcVar41 = (char *)-lVar40;
      if (pcVar10 <= pcVar41) goto LAB_016657e8;
      pbVar11 = (byte *)((long)this_02 - lVar40);
      goto LAB_016657c3;
    }
  }
  goto LAB_01665508;
  while( true ) {
    pcVar41 = pcVar41 + 1;
    pbVar11 = pbVar11 + 1;
    if (pcVar10 <= pcVar41) break;
LAB_016657c3:
    if ((4 < *pbVar11 - 9) && (*pbVar11 != 0x20)) goto switchD_01662c6a_default;
  }
LAB_01665508:
  local_128.type_._0_8_ = pp_Var21;
  pcVar41 = &DAT_00000001;
LAB_016657e8:
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                    ((IntegerDecimalCastData<short> *)&local_128);
LAB_01667032:
  if (bVar5 != true || pcVar41 == (char *)0x0) goto switchD_01662c6a_default;
  goto switchD_01662c4d_caseD_19;
  while( true ) {
    bVar34 = (byte)(0xb0 - bVar25) / 10;
    if (SBORROW1(cVar24,-bVar34) != (char)(cVar24 + bVar34) < '\0') goto LAB_01664edc;
    uVar22 = uVar13;
    if (pcVar10 + ~uVar18 == pcVar14) break;
    if ((pcVar14 + 1)[lVar40] == '_') {
      if ((pcVar10 + (-2 - uVar18) == pcVar14) ||
         (uVar22 = uVar18 + 2,
         9 < (byte)(pcVar14[(long)((long)(&this_02->states + -0x1f) + uVar18)] - 0x30U)))
      goto LAB_01664edc;
    }
    else {
      uVar22 = uVar18 + 1;
    }
    cVar24 = (cVar24 * '\n' - bVar25) + '0';
    uVar18 = uVar22;
    if (uVar13 <= uVar22) break;
LAB_01662e49:
    lVar40 = (long)&((BaseScanner *)(&this_02->states + -0x20))->_vptr_BaseScanner + uVar18;
    bVar25 = pcVar14[lVar40];
    if (9 < (byte)(bVar25 - 0x30)) {
      uVar20 = uVar18;
      if (bVar25 == 0x2e) {
        uVar20 = uVar18 + 1;
        uVar22 = uVar18;
        if (uVar13 <= uVar20) break;
        if ((uVar18 < 2) || (bVar25 = (pcVar14 + 1)[lVar40], (byte)(bVar25 - 0x30) < 10))
        goto LAB_01664edc;
      }
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto LAB_01664edc;
      uVar20 = uVar20 + 1;
      uVar22 = uVar20;
      if (uVar20 < uVar13) goto LAB_01664e2d;
      break;
    }
  }
  goto joined_r0x016671ae;
  while (uVar20 = uVar20 + 1, uVar22 = uVar13, uVar13 != uVar20) {
LAB_01664e2d:
    if ((4 < (byte)pcVar14[(long)&((BaseScanner *)(&this_02->states + -0x20))->_vptr_BaseScanner +
                           uVar20] - 9) &&
       (pcVar14[(long)&((BaseScanner *)(&this_02->states + -0x20))->_vptr_BaseScanner + uVar20] !=
        0x20)) goto LAB_01664edc;
  }
joined_r0x016671ae:
  bVar5 = true;
  if (1 < uVar22) goto LAB_01667445;
  goto LAB_01664edc;
  while( true ) {
    pcVar4 = pcVar44;
    if (pcVar10 + (-2 - (long)pcVar41) != pcVar14) {
      if ((pcVar14 + 2)[(long)pcVar29] == '_') {
        if ((pcVar10 + (-3 - (long)pcVar41) == pcVar14) ||
           (((pcVar14 + 3)[(long)pcVar29] & 0xfeU) != 0x30)) goto LAB_01664edc;
        pcVar4 = pcVar41 + 2;
      }
      else {
        pcVar4 = pcVar41 + 1;
      }
    }
    pcVar41 = pcVar4;
    if ('?' < (char)bVar25) goto LAB_01664edc;
    bVar25 = bVar25 * '\x02' | bVar34;
    if (pcVar44 <= pcVar41) break;
LAB_016649b7:
    pcVar29 = pcVar41 + (long)this_02;
    if ((pcVar14 + 1)[(long)pcVar29] == '0') {
      bVar34 = 0;
    }
    else {
      if ((pcVar14 + 1)[(long)pcVar29] != '1') goto LAB_01664edc;
      bVar34 = 1;
    }
  }
  goto LAB_01667445;
  while( true ) {
    pcVar41 = pcVar4;
    if ((char)(((byte)((char)bVar32 >> 7) >> 4) + (bVar32 ^ 0x7f)) >> 4 < cVar24) goto LAB_01664edc;
    cVar24 = bVar32 + cVar24 * '\x10';
    if (pcVar44 <= pcVar41) break;
LAB_0166433c:
    pcVar29 = pcVar41 + (long)this_02;
    bVar25 = (pcVar14 + 1)[(long)pcVar29];
    bVar34 = bVar25 | 0x20;
    if (0x19 < (byte)(bVar25 + 0xbf)) {
      bVar34 = bVar25;
    }
    bVar25 = bVar34 - 0x30;
    if ((byte)(bVar34 + 0x9f) < 6 || bVar25 < 10) {
      bVar32 = bVar34 + 0xa9;
      if (bVar34 < 0x61) {
        bVar32 = bVar25;
      }
    }
    else {
      bVar32 = bVar25;
      if (5 < (byte)(bVar34 + 0xbf)) goto LAB_01664edc;
    }
    pcVar4 = pcVar44;
    if (pcVar10 + (-2 - (long)pcVar41) != pcVar14) {
      if ((pcVar14 + 2)[(long)pcVar29] == '_') {
        if (pcVar10 + (-3 - (long)pcVar41) == pcVar14) goto LAB_01664edc;
        pcVar4 = pcVar41 + 2;
        if ((9 < (byte)((pcVar14 + 3)[(long)pcVar29] - 0x30U)) &&
           ((uVar37 = (byte)(pcVar14 + 3)[(long)pcVar29] - 0x41, 0x25 < uVar37 ||
            ((0x3f0000003fU >> ((ulong)uVar37 & 0x3f) & 1) == 0)))) goto LAB_01664edc;
      }
      else {
        pcVar4 = pcVar41 + 1;
      }
    }
  }
  goto LAB_01667445;
  while( true ) {
    if ((char)((byte)(0xaf - bVar25) / 10) < cVar24) goto LAB_01664edc;
    uVar18 = uVar20;
    if (pcVar10 + ~uVar22 == pcVar14) break;
    if ((pcVar14 + 1)[lVar40] == '_') {
      if ((pcVar10 + (-2 - uVar22) == pcVar14) ||
         (uVar18 = uVar22 + 2,
         9 < (byte)(pcVar14[(long)((long)(&this_02->states + -0x1f) + uVar22)] - 0x30U)))
      goto LAB_01664edc;
    }
    else {
      uVar18 = uVar22 + 1;
    }
    cVar24 = (bVar25 - 0x30) + cVar24 * '\n';
    uVar22 = uVar18;
    if (uVar20 <= uVar18) break;
LAB_016638f7:
    lVar40 = (long)&((BaseScanner *)(&this_02->states + -0x20))->_vptr_BaseScanner + uVar22;
    bVar25 = pcVar14[lVar40];
    if (9 < (byte)(bVar25 - 0x30)) {
      uVar18 = uVar22;
      if (bVar25 == 0x2e) {
        uVar18 = uVar22 + 1;
        if (uVar20 <= uVar18) {
          if (uVar22 <= uVar13) goto LAB_01664edc;
          break;
        }
        if ((uVar22 <= uVar13) || (bVar25 = (pcVar14 + 1)[lVar40], (byte)(bVar25 - 0x30) < 10))
        goto LAB_01664edc;
      }
      if ((4 < bVar25 - 9) && (bVar25 != 0x20)) goto LAB_01664edc;
      uVar22 = uVar18 + 1;
      uVar18 = uVar22;
      if (uVar22 < uVar20) goto LAB_01664eaa;
      break;
    }
  }
  goto LAB_01664ed0;
  while (uVar22 = uVar22 + 1, uVar18 = uVar20, uVar20 != uVar22) {
LAB_01664eaa:
    if ((4 < (byte)pcVar14[(long)&((BaseScanner *)(&this_02->states + -0x20))->_vptr_BaseScanner +
                           uVar22] - 9) &&
       (pcVar14[(long)&((BaseScanner *)(&this_02->states + -0x20))->_vptr_BaseScanner + uVar22] !=
        0x20)) goto LAB_01664edc;
  }
LAB_01664ed0:
  bVar5 = true;
  if (uVar13 < uVar18) goto LAB_01667445;
LAB_01664edc:
  pcVar14 = (char *)0x0;
  do {
    bVar25 = pcVar14[(long)(&this_02->states + -0x20)];
    if ((4 < bVar25 - 9) && (bVar25 != 0x20)) {
      local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      uVar18 = (long)pcVar10 - (long)pcVar14;
      if (bVar25 == 0x2d) {
        if (pcVar10 + -1 != pcVar14) {
          pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
          uVar13 = 1;
          goto LAB_01665030;
        }
        IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,true>
                  ((IntegerDecimalCastData<signed_char> *)&local_128);
      }
      else {
        if ((pcVar10 + -1 == pcVar14) || (bVar25 != 0x30)) {
LAB_01664f5e:
          uVar13 = (ulong)(bVar25 == 0x2b);
          if (uVar13 < uVar18) {
            pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
            uVar20 = uVar13;
            goto LAB_01664f8a;
          }
        }
        else {
          bVar34 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar14];
          if (0x61 < bVar34) {
            if (bVar34 == 0x62) goto LAB_01665205;
            if (bVar34 == 0x78) goto LAB_016650d5;
            goto LAB_01664f5e;
          }
          if (bVar34 == 0x42) {
LAB_01665205:
            pcVar44 = pcVar10 + ~(ulong)pcVar14;
            if (&DAT_00000001 < pcVar44) {
              pcVar41 = &DAT_00000001;
              pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              goto LAB_01665229;
            }
          }
          else {
            if (bVar34 != 0x58) goto LAB_01664f5e;
LAB_016650d5:
            pcVar44 = pcVar10 + ~(ulong)pcVar14;
            if (&DAT_00000001 < pcVar44) {
              pcVar41 = &DAT_00000001;
              pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              goto LAB_01665104;
            }
          }
        }
        IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>
                  ((IntegerDecimalCastData<signed_char> *)&local_128);
      }
      break;
    }
    pcVar14 = pcVar14 + 1;
  } while (pcVar10 != pcVar14);
  goto switchD_01662c6a_default;
  while( true ) {
    if ((pcVar14 + 1)[lVar40] == '_') {
      if ((pcVar10 + (-2 - uVar13) == pcVar14) ||
         (uVar31 = uVar13 + 2,
         9 < (byte)(pcVar14[(long)((long)(&this_02->states + -0x1f) + uVar13)] - 0x30U)))
      goto switchD_01662c6a_default;
    }
    else {
      uVar31 = uVar13 + 1;
    }
    uVar13 = uVar31;
    if (uVar18 <= uVar31) break;
LAB_01665030:
    lVar40 = (long)&((BaseScanner *)(&this_02->states + -0x20))->_vptr_BaseScanner + uVar13;
    bVar34 = pcVar14[lVar40];
    bVar25 = bVar34 - 0x30;
    if (9 < bVar25) {
      uVar20 = uVar13;
      local_128.type_._0_8_ = pp_Var21;
      if (bVar34 != 0x2e) goto LAB_01667272;
      uVar22 = uVar13 + 1;
      uVar31 = uVar22;
      if (uVar18 <= uVar22) goto LAB_01667335;
      peVar38 = (element_type *)0x0;
      uVar42 = 0;
      uVar23 = 0;
      uVar20 = uVar22;
      goto LAB_0166534a;
    }
    uVar20 = (0x8000000000000000 - (ulong)bVar25) / 10;
    if (SBORROW8((long)pp_Var21,-uVar20) != (long)((long)pp_Var21 + uVar20) < 0)
    goto switchD_01662c6a_default;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)pp_Var21 * 10 - (ulong)bVar25);
    uVar31 = uVar18;
    if (pcVar10 + ~uVar13 == pcVar14) break;
  }
  goto LAB_016653ea;
LAB_0166534a:
  lVar40 = (long)&((BaseScanner *)(&this_02->states + -0x20))->_vptr_BaseScanner + uVar20;
  bVar34 = pcVar14[lVar40];
  bVar25 = bVar34 - 0x30;
  if (bVar25 < 10) {
    if ((long)peVar38 <= (long)(((ulong)bVar25 ^ 0x7ffffffffffffffe) / 10)) {
      uVar42 = uVar23 + 1;
      peVar38 = (element_type *)((ulong)bVar25 + (long)peVar38 * 10);
      uVar23 = uVar42;
    }
    uVar31 = uVar18;
    if (pcVar10 + ~uVar20 == pcVar14) goto LAB_0166732a;
    if ((pcVar14 + 1)[lVar40] == '_') {
      if ((pcVar10 + (-2 - uVar20) == pcVar14) ||
         (uVar31 = uVar20 + 2,
         9 < (byte)(pcVar14[(long)((long)(&this_02->states + -0x1f) + uVar20)] - 0x30U)))
      goto switchD_01662c6a_default;
    }
    else {
      uVar31 = uVar20 + 1;
    }
    uVar20 = uVar31;
    if (uVar18 <= uVar31) goto LAB_0166732a;
    goto LAB_0166534a;
  }
  local_128.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._2_6_ = 0;
  local_128.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_2_ =
       uVar42;
  local_128.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar38;
  if (uVar20 <= uVar22 && uVar13 < 2) goto switchD_01662c6a_default;
LAB_01667272:
  bVar5 = false;
  uVar37 = (uint)bVar34;
  if (bVar34 < 0x20) {
    if (4 < uVar37 - 9) goto LAB_01667445;
  }
  else {
    if ((bVar34 == 0x65) || (uVar37 == 0x45)) {
      if ((uVar20 != 1) && (uVar20 + 1 < uVar18)) {
        local_a8.type_.id_ = INVALID;
        local_a8.type_.physical_type_ = ~INVALID;
        pcVar44 = pcVar14 + (long)&((BaseScanner *)(&this_02->states + -0x20))->_vptr_BaseScanner +
                            uVar20 + 1;
        if (*pcVar44 == '-') {
          bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar44,(idx_t)(pcVar10 + (~(ulong)pcVar14 - uVar20)),
                             (IntegerCastData<short> *)&local_a8,false);
        }
        else {
          bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar44,(idx_t)(pcVar10 + (~(ulong)pcVar14 - uVar20)),
                             (IntegerCastData<short> *)&local_a8,false);
        }
        if (bVar5 != false) {
          bVar5 = IntegerDecimalCastOperation::
                  HandleExponent<duckdb::IntegerDecimalCastData<signed_char>,true>
                            ((IntegerDecimalCastData<signed_char> *)&local_128,local_a8.type_._0_2_)
          ;
          goto LAB_01666fc5;
        }
      }
      goto switchD_01662c6a_default;
    }
    if (uVar37 != 0x20) goto LAB_01667445;
  }
  uVar20 = uVar20 + 1;
  uVar31 = uVar20;
  if (uVar20 < uVar18) {
    do {
      if ((4 < (byte)pcVar14[(long)&((BaseScanner *)(&this_02->states + -0x20))->_vptr_BaseScanner +
                             uVar20] - 9) &&
         (pcVar14[(long)&((BaseScanner *)(&this_02->states + -0x20))->_vptr_BaseScanner + uVar20] !=
          0x20)) goto switchD_01662c6a_default;
      uVar20 = uVar20 + 1;
      uVar31 = uVar18;
    } while (uVar18 != uVar20);
  }
LAB_016653ea:
  local_128.type_._0_8_ = pp_Var21;
  bVar45 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,true>
                     ((IntegerDecimalCastData<signed_char> *)&local_128);
  bVar5 = uVar31 < 2;
LAB_01667051:
  bVar5 = !bVar5;
  goto LAB_01667054;
LAB_0166732a:
  local_128.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._2_6_ = 0;
  local_128.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_2_ =
       uVar42;
  local_128.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar38;
LAB_01667335:
  if ((uVar13 < 2) && (uVar31 <= uVar22)) goto switchD_01662c6a_default;
  goto LAB_016653ea;
  while( true ) {
    pcVar4 = pcVar44;
    if (pcVar10 + (-2 - (long)pcVar41) != pcVar14) {
      if ((pcVar14 + 2)[(long)pcVar29] == '_') {
        if ((pcVar10 + (-3 - (long)pcVar41) == pcVar14) ||
           (((pcVar14 + 3)[(long)pcVar29] & 0xfeU) != 0x30)) goto switchD_01662c6a_default;
        pcVar4 = pcVar41 + 2;
      }
      else {
        pcVar4 = pcVar41 + 1;
      }
    }
    pcVar41 = pcVar4;
    if (0x3fffffffffffffff < (long)pp_Var21) goto switchD_01662c6a_default;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)(lVar40 + (long)pp_Var21 * 2);
    if (pcVar44 <= pcVar41) break;
LAB_01665229:
    pcVar29 = pcVar41 + (long)this_02;
    if ((pcVar14 + 1)[(long)pcVar29] == '0') {
      lVar40 = 0;
    }
    else {
      if ((pcVar14 + 1)[(long)pcVar29] != '1') goto switchD_01662c6a_default;
      lVar40 = 1;
    }
  }
  local_128.type_._0_8_ = pp_Var21;
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>
                    ((IntegerDecimalCastData<signed_char> *)&local_128);
  goto LAB_01666fc5;
  while( true ) {
    if ((pcVar14 + 1)[lVar40] == '_') {
      if ((pcVar10 + (-2 - uVar20) == pcVar14) ||
         (uVar31 = uVar20 + 2,
         9 < (byte)(pcVar14[(long)((long)(&this_02->states + -0x1f) + uVar20)] - 0x30U)))
      goto switchD_01662c6a_default;
    }
    else {
      uVar31 = uVar20 + 1;
    }
    uVar20 = uVar31;
    if (uVar18 <= uVar31) break;
LAB_01664f8a:
    lVar40 = (long)&((BaseScanner *)(&this_02->states + -0x20))->_vptr_BaseScanner + uVar20;
    bVar34 = pcVar14[lVar40];
    bVar25 = bVar34 - 0x30;
    if (9 < bVar25) {
      uVar22 = uVar20;
      local_128.type_._0_8_ = pp_Var21;
      if (bVar34 != 0x2e) goto LAB_01667374;
      local_d8 = uVar20 + 1;
      uVar31 = local_d8;
      if (uVar18 <= local_d8) goto LAB_0166742e;
      peVar38 = (element_type *)0x0;
      local_d0 = 0;
      uVar39 = 0;
      uVar22 = local_d8;
      goto LAB_0166709d;
    }
    if ((long)(((ulong)bVar25 ^ 0x7ffffffffffffffe) / 10) < (long)pp_Var21)
    goto switchD_01662c6a_default;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((ulong)bVar25 + (long)pp_Var21 * 10);
    uVar31 = uVar18;
    if (pcVar10 + ~uVar20 == pcVar14) break;
  }
  goto LAB_01667139;
LAB_0166709d:
  lVar40 = (long)&((BaseScanner *)(&this_02->states + -0x20))->_vptr_BaseScanner + uVar22;
  bVar34 = pcVar14[lVar40];
  bVar25 = bVar34 - 0x30;
  if (bVar25 < 10) {
    if ((long)peVar38 <= (long)(((ulong)bVar25 ^ 0x7ffffffffffffffe) / 10)) {
      uVar39 = (ulong)((int)uVar39 + 1);
      peVar38 = (element_type *)((ulong)bVar25 + (long)peVar38 * 10);
      local_d0 = uVar39;
    }
    uVar31 = uVar18;
    if (pcVar10 + ~uVar22 == pcVar14) goto LAB_0166741f;
    if ((pcVar14 + 1)[lVar40] == '_') {
      if ((pcVar10 + (-2 - uVar22) == pcVar14) ||
         (uVar31 = uVar22 + 2,
         9 < (byte)(pcVar14[(long)((long)(&this_02->states + -0x1f) + uVar22)] - 0x30U)))
      goto switchD_01662c6a_default;
    }
    else {
      uVar31 = uVar22 + 1;
    }
    uVar22 = uVar31;
    if (uVar18 <= uVar31) goto LAB_0166741f;
    goto LAB_0166709d;
  }
  local_128.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d0 & 0xffff);
  local_128.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar38;
  if (uVar22 <= local_d8 && uVar20 <= uVar13) goto switchD_01662c6a_default;
LAB_01667374:
  bVar5 = false;
  uVar37 = (uint)bVar34;
  if (bVar34 < 0x20) {
    if (4 < uVar37 - 9) goto LAB_01667445;
  }
  else {
    if ((bVar34 == 0x65) || (uVar37 == 0x45)) {
      if ((uVar22 != uVar13) && (uVar22 + 1 < uVar18)) {
        local_a8.type_.id_ = INVALID;
        local_a8.type_.physical_type_ = ~INVALID;
        pcVar44 = pcVar14 + (long)&((BaseScanner *)(&this_02->states + -0x20))->_vptr_BaseScanner +
                            uVar22 + 1;
        if (*pcVar44 == '-') {
          bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar44,(idx_t)(pcVar10 + (~(ulong)pcVar14 - uVar22)),
                             (IntegerCastData<short> *)&local_a8,false);
        }
        else {
          bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar44,(idx_t)(pcVar10 + (~(ulong)pcVar14 - uVar22)),
                             (IntegerCastData<short> *)&local_a8,false);
        }
        if (bVar5 != false) {
          bVar5 = IntegerDecimalCastOperation::
                  HandleExponent<duckdb::IntegerDecimalCastData<signed_char>,false>
                            ((IntegerDecimalCastData<signed_char> *)&local_128,local_a8.type_._0_2_)
          ;
          goto LAB_01666fc5;
        }
      }
      goto switchD_01662c6a_default;
    }
    if (uVar37 != 0x20) goto LAB_01667445;
  }
  uVar22 = uVar22 + 1;
  uVar31 = uVar22;
  if (uVar22 < uVar18) {
    do {
      if ((4 < (byte)pcVar14[(long)&((BaseScanner *)(&this_02->states + -0x20))->_vptr_BaseScanner +
                             uVar22] - 9) &&
         (pcVar14[(long)&((BaseScanner *)(&this_02->states + -0x20))->_vptr_BaseScanner + uVar22] !=
          0x20)) goto switchD_01662c6a_default;
      uVar22 = uVar22 + 1;
      uVar31 = uVar18;
    } while (uVar18 != uVar22);
  }
LAB_01667139:
  local_128.type_._0_8_ = pp_Var21;
  bVar45 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>
                     ((IntegerDecimalCastData<signed_char> *)&local_128);
  bVar5 = uVar13 < uVar31;
LAB_01667054:
  if ((bVar45 & bVar5) == 0) goto switchD_01662c6a_default;
  goto switchD_01662c4d_caseD_19;
LAB_0166741f:
  local_128.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d0 & 0xffff);
  local_128.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar38;
LAB_0166742e:
  if ((uVar20 <= uVar13) && (uVar31 <= local_d8)) goto switchD_01662c6a_default;
  goto LAB_01667139;
  while( true ) {
    pcVar41 = pcVar4;
    if ((long)((ulong)(bVar32 >> 4) ^ 0x7ffffffffffffff) < (long)pp_Var21)
    goto switchD_01662c6a_default;
    pp_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
               ((long)pp_Var21 * 0x10 + (ulong)bVar32);
    if (pcVar44 <= pcVar41) break;
LAB_01665104:
    pcVar29 = pcVar41 + (long)this_02;
    bVar25 = (pcVar14 + 1)[(long)pcVar29];
    bVar34 = bVar25 | 0x20;
    if (0x19 < (byte)(bVar25 + 0xbf)) {
      bVar34 = bVar25;
    }
    bVar25 = bVar34 - 0x30;
    if ((byte)(bVar34 + 0x9f) < 6 || bVar25 < 10) {
      bVar32 = bVar34 + 0xa9;
      if (bVar34 < 0x61) {
        bVar32 = bVar25;
      }
    }
    else {
      bVar32 = bVar25;
      if (5 < (byte)(bVar34 + 0xbf)) goto switchD_01662c6a_default;
    }
    pcVar4 = pcVar44;
    if (pcVar10 + (-2 - (long)pcVar41) != pcVar14) {
      if ((pcVar14 + 2)[(long)pcVar29] == '_') {
        if (pcVar10 + (-3 - (long)pcVar41) == pcVar14) goto switchD_01662c6a_default;
        pcVar4 = pcVar41 + 2;
        if (9 < (byte)((pcVar14 + 3)[(long)pcVar29] - 0x30U)) {
          bVar5 = false;
          uVar37 = (byte)(pcVar14 + 3)[(long)pcVar29] - 0x41;
          if ((0x25 < uVar37) || ((0x3f0000003fU >> ((ulong)uVar37 & 0x3f) & 1) == 0))
          goto LAB_01667445;
        }
      }
      else {
        pcVar4 = pcVar41 + 1;
      }
    }
  }
  local_128.type_._0_8_ = pp_Var21;
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>
                    ((IntegerDecimalCastData<signed_char> *)&local_128);
LAB_01666fc5:
  if (bVar5 == false) {
switchD_01662c6a_default:
    bVar5 = false;
  }
  else {
switchD_01662c4d_caseD_19:
    bVar5 = true;
  }
LAB_01667445:
  if (local_68 != (BaseScanner *)local_58) {
    operator_delete(local_68);
  }
  return bVar5;
}

Assistant:

bool CSVSniffer::CanYouCastIt(ClientContext &context, const string_t value, const LogicalType &type,
                              const DialectOptions &dialect_options, const bool is_null, const char decimal_separator,
                              const char thousands_separator) {
	if (is_null) {
		return true;
	}
	auto value_ptr = value.GetData();
	auto value_size = value.GetSize();
	string strip_thousands;
	if (type.IsNumeric() && thousands_separator != '\0') {
		// If we have a thousands separator we should try to use that
		strip_thousands = BaseScanner::RemoveSeparator(value_ptr, value_size, thousands_separator);
		value_ptr = strip_thousands.c_str();
		value_size = strip_thousands.size();
	}
	switch (type.id()) {
	case LogicalTypeId::BOOLEAN: {
		bool dummy_value;
		return TryCastStringBool(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::TINYINT: {
		int8_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, false);
	}
	case LogicalTypeId::SMALLINT: {
		int16_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::INTEGER: {
		int32_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::BIGINT: {
		int64_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::UTINYINT: {
		uint8_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::USMALLINT: {
		uint16_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::UINTEGER: {
		uint32_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::UBIGINT: {
		uint64_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::DOUBLE: {
		double dummy_value;
		return TryDoubleCast<double>(value_ptr, value_size, dummy_value, true, decimal_separator);
	}
	case LogicalTypeId::FLOAT: {
		float dummy_value;
		return TryDoubleCast<float>(value_ptr, value_size, dummy_value, true, decimal_separator);
	}
	case LogicalTypeId::DATE: {
		if (!dialect_options.date_format.find(LogicalTypeId::DATE)->second.GetValue().Empty()) {
			date_t result;
			string error_message;
			return dialect_options.date_format.find(LogicalTypeId::DATE)
			    ->second.GetValue()
			    .TryParseDate(value, result, error_message);
		}
		idx_t pos;
		bool special;
		date_t dummy_value;
		return Date::TryConvertDate(value_ptr, value_size, pos, dummy_value, special, true) == DateCastResult::SUCCESS;
	}
	case LogicalTypeId::TIMESTAMP: {
		timestamp_t dummy_value;
		if (!dialect_options.date_format.find(LogicalTypeId::TIMESTAMP)->second.GetValue().Empty()) {
			string error_message;
			return dialect_options.date_format.find(LogicalTypeId::TIMESTAMP)
			    ->second.GetValue()
			    .TryParseTimestamp(value, dummy_value, error_message);
		}
		return Timestamp::TryConvertTimestamp(value_ptr, value_size, dummy_value, nullptr, true) ==
		       TimestampCastResult::SUCCESS;
	}
	case LogicalTypeId::TIME: {
		idx_t pos;
		dtime_t dummy_value;
		return Time::TryConvertTime(value_ptr, value_size, pos, dummy_value, true);
	}
	case LogicalTypeId::DECIMAL: {
		uint8_t width, scale;
		type.GetDecimalProperties(width, scale);
		if (decimal_separator == ',') {
			switch (type.InternalType()) {
			case PhysicalType::INT16: {
				int16_t dummy_value;
				return TryDecimalStringCast<int16_t, ','>(value_ptr, value_size, dummy_value, width, scale);
			}

			case PhysicalType::INT32: {
				int32_t dummy_value;
				return TryDecimalStringCast<int32_t, ','>(value_ptr, value_size, dummy_value, width, scale);
			}

			case PhysicalType::INT64: {
				int64_t dummy_value;
				return TryDecimalStringCast<int64_t, ','>(value_ptr, value_size, dummy_value, width, scale);
			}

			case PhysicalType::INT128: {
				hugeint_t dummy_value;
				return TryDecimalStringCast<hugeint_t, ','>(value_ptr, value_size, dummy_value, width, scale);
			}

			default:
				throw InternalException("Invalid Physical Type for Decimal Value. Physical Type: " +
				                        TypeIdToString(type.InternalType()));
			}

		} else if (decimal_separator == '.') {
			switch (type.InternalType()) {
			case PhysicalType::INT16: {
				int16_t dummy_value;
				return TryDecimalStringCast(value_ptr, value_size, dummy_value, width, scale);
			}

			case PhysicalType::INT32: {
				int32_t dummy_value;
				return TryDecimalStringCast(value_ptr, value_size, dummy_value, width, scale);
			}

			case PhysicalType::INT64: {
				int64_t dummy_value;
				return TryDecimalStringCast(value_ptr, value_size, dummy_value, width, scale);
			}

			case PhysicalType::INT128: {
				hugeint_t dummy_value;
				return TryDecimalStringCast(value_ptr, value_size, dummy_value, width, scale);
			}

			default:
				throw InternalException("Invalid Physical Type for Decimal Value. Physical Type: " +
				                        TypeIdToString(type.InternalType()));
			}
		}
		throw InvalidInputException("Decimals can only have ',' and '.' as decimal separators");
	}
	case LogicalTypeId::VARCHAR:
		return true;
	default: {
		// We do Value Try Cast for non-basic types.
		Value new_value;
		string error_message;
		Value str_value(value);
		bool success = str_value.TryCastAs(context, type, new_value, &error_message, true);
		return success && error_message.empty();
	}
	}
}